

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  uint uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [28];
  uint uVar97;
  int iVar98;
  uint uVar99;
  ulong uVar100;
  ulong uVar101;
  undefined1 auVar107 [16];
  ulong uVar102;
  long lVar103;
  undefined4 uVar104;
  undefined8 uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar108 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined8 uVar124;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  undefined1 auVar143 [16];
  float fVar142;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined8 uVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar209 [64];
  undefined4 uVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  float fVar218;
  undefined1 in_ZMM12 [64];
  undefined1 auVar217 [64];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar219 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_860 [32];
  RTCFilterFunctionNArguments local_808;
  RayQueryContext *local_7d8;
  RayHitK<8> *local_7d0;
  undefined1 (*local_7c8) [32];
  undefined1 local_7c0 [32];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [2] [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  int iStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  int local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  
  PVar16 = prim[1];
  uVar102 = (ulong)(byte)PVar16;
  fVar142 = *(float *)(prim + uVar102 * 0x19 + 0x12);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar19 = vsubps_avx(auVar19,*(undefined1 (*) [16])(prim + uVar102 * 0x19 + 6));
  auVar106._0_4_ = fVar142 * auVar19._0_4_;
  auVar106._4_4_ = fVar142 * auVar19._4_4_;
  auVar106._8_4_ = fVar142 * auVar19._8_4_;
  auVar106._12_4_ = fVar142 * auVar19._12_4_;
  auVar193._0_4_ = fVar142 * auVar20._0_4_;
  auVar193._4_4_ = fVar142 * auVar20._4_4_;
  auVar193._8_4_ = fVar142 * auVar20._8_4_;
  auVar193._12_4_ = fVar142 * auVar20._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar119 = vpmovsxbd_avx2(auVar19);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar121 = vpmovsxbd_avx2(auVar20);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar178 = vpmovsxbd_avx2(auVar107);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 6);
  auVar117 = vpmovsxbd_avx2(auVar10);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar16 * 0xc) + 6);
  auVar132 = vpmovsxbd_avx2(auVar11);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (uint)(byte)PVar16 * 0xc + uVar102 + 6);
  auVar205 = vpmovsxbd_avx2(auVar12);
  auVar205 = vcvtdq2ps_avx(auVar205);
  uVar100 = (ulong)(uint)((int)(uVar102 * 9) * 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar100 + 6);
  auVar174 = vpmovsxbd_avx2(auVar13);
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar100 + uVar102 + 6);
  auVar154 = vpmovsxbd_avx2(auVar14);
  auVar154 = vcvtdq2ps_avx(auVar154);
  uVar100 = (ulong)(uint)((int)(uVar102 * 5) << 2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar100 + 6);
  auVar23 = vpmovsxbd_avx2(auVar15);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar225._4_4_ = auVar193._0_4_;
  auVar225._0_4_ = auVar193._0_4_;
  auVar225._8_4_ = auVar193._0_4_;
  auVar225._12_4_ = auVar193._0_4_;
  auVar225._16_4_ = auVar193._0_4_;
  auVar225._20_4_ = auVar193._0_4_;
  auVar225._24_4_ = auVar193._0_4_;
  auVar225._28_4_ = auVar193._0_4_;
  auVar19 = vmovshdup_avx(auVar193);
  uVar192 = auVar19._0_8_;
  auVar230._8_8_ = uVar192;
  auVar230._0_8_ = uVar192;
  auVar230._16_8_ = uVar192;
  auVar230._24_8_ = uVar192;
  auVar19 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar142 = auVar19._0_4_;
  auVar209._0_4_ = fVar142 * auVar178._0_4_;
  fVar141 = auVar19._4_4_;
  auVar209._4_4_ = fVar141 * auVar178._4_4_;
  auVar209._8_4_ = fVar142 * auVar178._8_4_;
  auVar209._12_4_ = fVar141 * auVar178._12_4_;
  auVar209._16_4_ = fVar142 * auVar178._16_4_;
  auVar209._20_4_ = fVar141 * auVar178._20_4_;
  auVar209._28_36_ = in_ZMM12._28_36_;
  auVar209._24_4_ = fVar142 * auVar178._24_4_;
  auVar217._0_4_ = auVar205._0_4_ * fVar142;
  auVar217._4_4_ = auVar205._4_4_ * fVar141;
  auVar217._8_4_ = auVar205._8_4_ * fVar142;
  auVar217._12_4_ = auVar205._12_4_ * fVar141;
  auVar217._16_4_ = auVar205._16_4_ * fVar142;
  auVar217._20_4_ = auVar205._20_4_ * fVar141;
  auVar217._28_36_ = in_ZMM10._28_36_;
  auVar217._24_4_ = auVar205._24_4_ * fVar142;
  auVar201._0_4_ = auVar23._0_4_ * fVar142;
  auVar201._4_4_ = auVar23._4_4_ * fVar141;
  auVar201._8_4_ = auVar23._8_4_ * fVar142;
  auVar201._12_4_ = auVar23._12_4_ * fVar141;
  auVar201._16_4_ = auVar23._16_4_ * fVar142;
  auVar201._20_4_ = auVar23._20_4_ * fVar141;
  auVar201._24_4_ = auVar23._24_4_ * fVar142;
  auVar201._28_4_ = 0;
  auVar19 = vfmadd231ps_fma(auVar209._0_32_,auVar230,auVar121);
  auVar20 = vfmadd231ps_fma(auVar217._0_32_,auVar230,auVar132);
  auVar107 = vfmadd231ps_fma(auVar201,auVar154,auVar230);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar225,auVar119);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar225,auVar117);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar174,auVar225);
  auVar226._4_4_ = auVar106._0_4_;
  auVar226._0_4_ = auVar106._0_4_;
  auVar226._8_4_ = auVar106._0_4_;
  auVar226._12_4_ = auVar106._0_4_;
  auVar226._16_4_ = auVar106._0_4_;
  auVar226._20_4_ = auVar106._0_4_;
  auVar226._24_4_ = auVar106._0_4_;
  auVar226._28_4_ = auVar106._0_4_;
  auVar19 = vmovshdup_avx(auVar106);
  uVar192 = auVar19._0_8_;
  auVar231._8_8_ = uVar192;
  auVar231._0_8_ = uVar192;
  auVar231._16_8_ = uVar192;
  auVar231._24_8_ = uVar192;
  auVar19 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar142 = auVar19._0_4_;
  auVar196._0_4_ = fVar142 * auVar178._0_4_;
  fVar141 = auVar19._4_4_;
  auVar196._4_4_ = fVar141 * auVar178._4_4_;
  auVar196._8_4_ = fVar142 * auVar178._8_4_;
  auVar196._12_4_ = fVar141 * auVar178._12_4_;
  auVar196._16_4_ = fVar142 * auVar178._16_4_;
  auVar196._20_4_ = fVar141 * auVar178._20_4_;
  auVar196._24_4_ = fVar142 * auVar178._24_4_;
  auVar196._28_4_ = 0;
  auVar22._4_4_ = auVar205._4_4_ * fVar141;
  auVar22._0_4_ = auVar205._0_4_ * fVar142;
  auVar22._8_4_ = auVar205._8_4_ * fVar142;
  auVar22._12_4_ = auVar205._12_4_ * fVar141;
  auVar22._16_4_ = auVar205._16_4_ * fVar142;
  auVar22._20_4_ = auVar205._20_4_ * fVar141;
  auVar22._24_4_ = auVar205._24_4_ * fVar142;
  auVar22._28_4_ = auVar178._28_4_;
  auVar178._4_4_ = auVar23._4_4_ * fVar141;
  auVar178._0_4_ = auVar23._0_4_ * fVar142;
  auVar178._8_4_ = auVar23._8_4_ * fVar142;
  auVar178._12_4_ = auVar23._12_4_ * fVar141;
  auVar178._16_4_ = auVar23._16_4_ * fVar142;
  auVar178._20_4_ = auVar23._20_4_ * fVar141;
  auVar178._24_4_ = auVar23._24_4_ * fVar142;
  auVar178._28_4_ = fVar141;
  auVar19 = vfmadd231ps_fma(auVar196,auVar231,auVar121);
  auVar11 = vfmadd231ps_fma(auVar22,auVar231,auVar132);
  auVar12 = vfmadd231ps_fma(auVar178,auVar231,auVar154);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar226,auVar119);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar226,auVar117);
  local_2e0._8_4_ = 0x7fffffff;
  local_2e0._0_8_ = 0x7fffffff7fffffff;
  local_2e0._12_4_ = 0x7fffffff;
  local_2e0._16_4_ = 0x7fffffff;
  local_2e0._20_4_ = 0x7fffffff;
  local_2e0._24_4_ = 0x7fffffff;
  local_2e0._28_4_ = 0x7fffffff;
  auVar151._8_4_ = 0x219392ef;
  auVar151._0_8_ = 0x219392ef219392ef;
  auVar151._12_4_ = 0x219392ef;
  auVar151._16_4_ = 0x219392ef;
  auVar151._20_4_ = 0x219392ef;
  auVar151._24_4_ = 0x219392ef;
  auVar151._28_4_ = 0x219392ef;
  auVar119 = vandps_avx(ZEXT1632(auVar10),local_2e0);
  auVar119 = vcmpps_avx(auVar119,auVar151,1);
  auVar121 = vblendvps_avx(ZEXT1632(auVar10),auVar151,auVar119);
  auVar119 = vandps_avx(ZEXT1632(auVar20),local_2e0);
  auVar119 = vcmpps_avx(auVar119,auVar151,1);
  auVar178 = vblendvps_avx(ZEXT1632(auVar20),auVar151,auVar119);
  auVar119 = vandps_avx(ZEXT1632(auVar107),local_2e0);
  auVar119 = vcmpps_avx(auVar119,auVar151,1);
  auVar119 = vblendvps_avx(ZEXT1632(auVar107),auVar151,auVar119);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar226,auVar174);
  auVar117 = vrcpps_avx(auVar121);
  auVar172._8_4_ = 0x3f800000;
  auVar172._0_8_ = 0x3f8000003f800000;
  auVar172._12_4_ = 0x3f800000;
  auVar172._16_4_ = 0x3f800000;
  auVar172._20_4_ = 0x3f800000;
  auVar172._24_4_ = 0x3f800000;
  auVar172._28_4_ = 0x3f800000;
  auVar19 = vfnmadd213ps_fma(auVar121,auVar117,auVar172);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar117,auVar117);
  auVar121 = vrcpps_avx(auVar178);
  auVar20 = vfnmadd213ps_fma(auVar178,auVar121,auVar172);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar121,auVar121);
  auVar121 = vrcpps_avx(auVar119);
  auVar107 = vfnmadd213ps_fma(auVar119,auVar121,auVar172);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar121,auVar121);
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar13));
  auVar117._4_4_ = auVar19._4_4_ * auVar119._4_4_;
  auVar117._0_4_ = auVar19._0_4_ * auVar119._0_4_;
  auVar117._8_4_ = auVar19._8_4_ * auVar119._8_4_;
  auVar117._12_4_ = auVar19._12_4_ * auVar119._12_4_;
  auVar117._16_4_ = auVar119._16_4_ * 0.0;
  auVar117._20_4_ = auVar119._20_4_ * 0.0;
  auVar117._24_4_ = auVar119._24_4_ * 0.0;
  auVar117._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar13));
  auVar132._4_4_ = auVar19._4_4_ * auVar119._4_4_;
  auVar132._0_4_ = auVar19._0_4_ * auVar119._0_4_;
  auVar132._8_4_ = auVar19._8_4_ * auVar119._8_4_;
  auVar132._12_4_ = auVar19._12_4_ * auVar119._12_4_;
  auVar132._16_4_ = auVar119._16_4_ * 0.0;
  auVar132._20_4_ = auVar119._20_4_ * 0.0;
  auVar132._24_4_ = auVar119._24_4_ * 0.0;
  auVar132._28_4_ = auVar119._28_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar16;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar16 * 0x10 + 6));
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar16 * 0x10 + uVar102 * -2 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar11));
  auVar205._4_4_ = auVar119._4_4_ * auVar20._4_4_;
  auVar205._0_4_ = auVar119._0_4_ * auVar20._0_4_;
  auVar205._8_4_ = auVar119._8_4_ * auVar20._8_4_;
  auVar205._12_4_ = auVar119._12_4_ * auVar20._12_4_;
  auVar205._16_4_ = auVar119._16_4_ * 0.0;
  auVar205._20_4_ = auVar119._20_4_ * 0.0;
  auVar205._24_4_ = auVar119._24_4_ * 0.0;
  auVar205._28_4_ = auVar119._28_4_;
  auVar119 = vcvtdq2ps_avx(auVar121);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar11));
  auVar174._4_4_ = auVar20._4_4_ * auVar119._4_4_;
  auVar174._0_4_ = auVar20._0_4_ * auVar119._0_4_;
  auVar174._8_4_ = auVar20._8_4_ * auVar119._8_4_;
  auVar174._12_4_ = auVar20._12_4_ * auVar119._12_4_;
  auVar174._16_4_ = auVar119._16_4_ * 0.0;
  auVar174._20_4_ = auVar119._20_4_ * 0.0;
  auVar174._24_4_ = auVar119._24_4_ * 0.0;
  auVar174._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 + uVar102 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar10));
  auVar154._4_4_ = auVar119._4_4_ * auVar107._4_4_;
  auVar154._0_4_ = auVar119._0_4_ * auVar107._0_4_;
  auVar154._8_4_ = auVar119._8_4_ * auVar107._8_4_;
  auVar154._12_4_ = auVar119._12_4_ * auVar107._12_4_;
  auVar154._16_4_ = auVar119._16_4_ * 0.0;
  auVar154._20_4_ = auVar119._20_4_ * 0.0;
  auVar154._24_4_ = auVar119._24_4_ * 0.0;
  auVar154._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x17 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar10));
  auVar23._4_4_ = auVar107._4_4_ * auVar119._4_4_;
  auVar23._0_4_ = auVar107._0_4_ * auVar119._0_4_;
  auVar23._8_4_ = auVar107._8_4_ * auVar119._8_4_;
  auVar23._12_4_ = auVar107._12_4_ * auVar119._12_4_;
  auVar23._16_4_ = auVar119._16_4_ * 0.0;
  auVar23._20_4_ = auVar119._20_4_ * 0.0;
  auVar23._24_4_ = auVar119._24_4_ * 0.0;
  auVar23._28_4_ = auVar119._28_4_;
  auVar119 = vpminsd_avx2(auVar117,auVar132);
  auVar121 = vpminsd_avx2(auVar205,auVar174);
  auVar119 = vmaxps_avx(auVar119,auVar121);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar189._4_4_ = uVar104;
  auVar189._0_4_ = uVar104;
  auVar189._8_4_ = uVar104;
  auVar189._12_4_ = uVar104;
  auVar189._16_4_ = uVar104;
  auVar189._20_4_ = uVar104;
  auVar189._24_4_ = uVar104;
  auVar189._28_4_ = uVar104;
  auVar121 = vpminsd_avx2(auVar154,auVar23);
  auVar121 = vmaxps_avx(auVar121,auVar189);
  auVar119 = vmaxps_avx(auVar119,auVar121);
  local_80._4_4_ = auVar119._4_4_ * 0.99999964;
  local_80._0_4_ = auVar119._0_4_ * 0.99999964;
  local_80._8_4_ = auVar119._8_4_ * 0.99999964;
  local_80._12_4_ = auVar119._12_4_ * 0.99999964;
  local_80._16_4_ = auVar119._16_4_ * 0.99999964;
  local_80._20_4_ = auVar119._20_4_ * 0.99999964;
  local_80._24_4_ = auVar119._24_4_ * 0.99999964;
  local_80._28_4_ = auVar121._28_4_;
  auVar119 = vpmaxsd_avx2(auVar117,auVar132);
  auVar121 = vpmaxsd_avx2(auVar205,auVar174);
  auVar119 = vminps_avx(auVar119,auVar121);
  auVar121 = vpmaxsd_avx2(auVar154,auVar23);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar120._4_4_ = uVar104;
  auVar120._0_4_ = uVar104;
  auVar120._8_4_ = uVar104;
  auVar120._12_4_ = uVar104;
  auVar120._16_4_ = uVar104;
  auVar120._20_4_ = uVar104;
  auVar120._24_4_ = uVar104;
  auVar120._28_4_ = uVar104;
  auVar121 = vminps_avx(auVar121,auVar120);
  auVar119 = vminps_avx(auVar119,auVar121);
  auVar111._4_4_ = auVar119._4_4_ * 1.0000004;
  auVar111._0_4_ = auVar119._0_4_ * 1.0000004;
  auVar111._8_4_ = auVar119._8_4_ * 1.0000004;
  auVar111._12_4_ = auVar119._12_4_ * 1.0000004;
  auVar111._16_4_ = auVar119._16_4_ * 1.0000004;
  auVar111._20_4_ = auVar119._20_4_ * 1.0000004;
  auVar111._24_4_ = auVar119._24_4_ * 1.0000004;
  auVar111._28_4_ = auVar119._28_4_;
  auVar127[4] = PVar16;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar16;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar16;
  auVar127._13_3_ = 0;
  auVar127[0x10] = PVar16;
  auVar127._17_3_ = 0;
  auVar127[0x14] = PVar16;
  auVar127._21_3_ = 0;
  auVar127[0x18] = PVar16;
  auVar127._25_3_ = 0;
  auVar127[0x1c] = PVar16;
  auVar127._29_3_ = 0;
  auVar121 = vpcmpgtd_avx2(auVar127,_DAT_01fe9900);
  auVar119 = vcmpps_avx(local_80,auVar111,2);
  auVar119 = vandps_avx(auVar119,auVar121);
  uVar97 = vmovmskps_avx(auVar119);
  if (uVar97 != 0) {
    uVar97 = uVar97 & 0xff;
    local_6a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_6a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_6a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_6a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_7c8 = (undefined1 (*) [32])&local_1c0;
    iVar98 = 1 << ((uint)k & 0x1f);
    auVar119._4_4_ = iVar98;
    auVar119._0_4_ = iVar98;
    auVar119._8_4_ = iVar98;
    auVar119._12_4_ = iVar98;
    auVar119._16_4_ = iVar98;
    auVar119._20_4_ = iVar98;
    auVar119._24_4_ = iVar98;
    auVar119._28_4_ = iVar98;
    auVar121 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar119 = vpand_avx2(auVar119,auVar121);
    local_300 = vpcmpeqd_avx2(auVar119,auVar121);
    local_450 = 0x7fffffff;
    uStack_44c = 0x7fffffff;
    uStack_448 = 0x7fffffff;
    uStack_444 = 0x7fffffff;
    do {
      auVar119 = local_5e0;
      lVar24 = 0;
      uVar102 = (ulong)uVar97;
      for (uVar100 = uVar102; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_860._4_4_ = *(undefined4 *)(prim + 2);
      uVar97 = *(uint *)(prim + lVar24 * 4 + 6);
      pGVar17 = (context->scene->geometries).items[(uint)local_860._4_4_].ptr;
      uVar100 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                                pGVar17[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar97);
      p_Var18 = pGVar17[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar17[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar24 + (long)p_Var18 * uVar100);
      uVar192 = *(undefined8 *)*pauVar1;
      uVar88 = *(undefined8 *)(*pauVar1 + 8);
      auVar15 = *pauVar1;
      auVar12 = *pauVar1;
      auVar107 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar24 + (uVar100 + 1) * (long)p_Var18);
      uVar89 = *(undefined8 *)*pauVar2;
      uVar90 = *(undefined8 *)(*pauVar2 + 8);
      auVar14 = *pauVar2;
      auVar11 = *pauVar2;
      auVar20 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar100 + 2) * (long)p_Var18);
      uVar91 = *(undefined8 *)*pauVar3;
      uVar92 = *(undefined8 *)(*pauVar3 + 8);
      auVar13 = *pauVar3;
      auVar10 = *pauVar3;
      auVar19 = *pauVar3;
      uVar102 = uVar102 - 1 & uVar102;
      pauVar4 = (undefined1 (*) [12])(lVar24 + (uVar100 + 3) * (long)p_Var18);
      uVar93 = *(undefined8 *)*pauVar4;
      uVar94 = *(undefined8 *)(*pauVar4 + 8);
      local_8e0 = (float)uVar93;
      fStack_8dc = (float)((ulong)uVar93 >> 0x20);
      fStack_8d8 = (float)uVar94;
      fStack_8d4 = (float)((ulong)uVar94 >> 0x20);
      if (uVar102 != 0) {
        uVar101 = uVar102 - 1 & uVar102;
        for (uVar100 = uVar102; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        }
        if (uVar101 != 0) {
          for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar98 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar149 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar193 = vsubps_avx(*pauVar1,auVar149);
      uVar104 = auVar193._0_4_;
      auVar165._4_4_ = uVar104;
      auVar165._0_4_ = uVar104;
      auVar165._8_4_ = uVar104;
      auVar165._12_4_ = uVar104;
      auVar106 = vshufps_avx(auVar193,auVar193,0x55);
      auVar193 = vshufps_avx(auVar193,auVar193,0xaa);
      aVar8 = pre->ray_space[k].vx.field_0;
      aVar9 = pre->ray_space[k].vy.field_0;
      fVar142 = pre->ray_space[k].vz.field_0.m128[0];
      fVar141 = pre->ray_space[k].vz.field_0.m128[1];
      fVar179 = pre->ray_space[k].vz.field_0.m128[2];
      fVar180 = pre->ray_space[k].vz.field_0.m128[3];
      auVar185._0_4_ = fVar142 * auVar193._0_4_;
      auVar185._4_4_ = fVar141 * auVar193._4_4_;
      auVar185._8_4_ = fVar179 * auVar193._8_4_;
      auVar185._12_4_ = fVar180 * auVar193._12_4_;
      auVar106 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar9,auVar106);
      auVar185 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar8,auVar165);
      auVar106 = vblendps_avx(auVar185,*pauVar1,8);
      auVar21 = vsubps_avx(*pauVar2,auVar149);
      uVar104 = auVar21._0_4_;
      auVar186._4_4_ = uVar104;
      auVar186._0_4_ = uVar104;
      auVar186._8_4_ = uVar104;
      auVar186._12_4_ = uVar104;
      auVar193 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar206._0_4_ = fVar142 * auVar21._0_4_;
      auVar206._4_4_ = fVar141 * auVar21._4_4_;
      auVar206._8_4_ = fVar179 * auVar21._8_4_;
      auVar206._12_4_ = fVar180 * auVar21._12_4_;
      auVar193 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar9,auVar193);
      auVar186 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar8,auVar186);
      auVar193 = vblendps_avx(auVar186,*pauVar2,8);
      auVar165 = vsubps_avx(*pauVar3,auVar149);
      uVar104 = auVar165._0_4_;
      auVar194._4_4_ = uVar104;
      auVar194._0_4_ = uVar104;
      auVar194._8_4_ = uVar104;
      auVar194._12_4_ = uVar104;
      auVar21 = vshufps_avx(auVar165,auVar165,0x55);
      auVar165 = vshufps_avx(auVar165,auVar165,0xaa);
      auVar211._0_4_ = fVar142 * auVar165._0_4_;
      auVar211._4_4_ = fVar141 * auVar165._4_4_;
      auVar211._8_4_ = fVar179 * auVar165._8_4_;
      auVar211._12_4_ = fVar180 * auVar165._12_4_;
      auVar21 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar9,auVar21);
      auVar194 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar8,auVar194);
      auVar21 = vblendps_avx(auVar194,*pauVar3,8);
      auVar25._12_4_ = fStack_8d4;
      auVar25._0_12_ = *pauVar4;
      auVar165 = vsubps_avx(auVar25,auVar149);
      uVar104 = auVar165._0_4_;
      auVar195._4_4_ = uVar104;
      auVar195._0_4_ = uVar104;
      auVar195._8_4_ = uVar104;
      auVar195._12_4_ = uVar104;
      auVar149 = vshufps_avx(auVar165,auVar165,0x55);
      auVar165 = vshufps_avx(auVar165,auVar165,0xaa);
      auVar215._0_4_ = fVar142 * auVar165._0_4_;
      auVar215._4_4_ = fVar141 * auVar165._4_4_;
      auVar215._8_4_ = fVar179 * auVar165._8_4_;
      auVar215._12_4_ = fVar180 * auVar165._12_4_;
      auVar149 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar9,auVar149);
      auVar195 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar8,auVar195);
      auVar149 = vblendps_avx(auVar195,auVar25,8);
      auVar26._4_4_ = uStack_44c;
      auVar26._0_4_ = local_450;
      auVar26._8_4_ = uStack_448;
      auVar26._12_4_ = uStack_444;
      auVar106 = vandps_avx(auVar106,auVar26);
      auVar193 = vandps_avx(auVar193,auVar26);
      auVar165 = vmaxps_avx(auVar106,auVar193);
      auVar106 = vandps_avx(auVar21,auVar26);
      auVar193 = vandps_avx(auVar149,auVar26);
      auVar106 = vmaxps_avx(auVar106,auVar193);
      auVar106 = vmaxps_avx(auVar165,auVar106);
      auVar193 = vmovshdup_avx(auVar106);
      auVar193 = vmaxss_avx(auVar193,auVar106);
      auVar106 = vshufpd_avx(auVar106,auVar106,1);
      auVar106 = vmaxss_avx(auVar106,auVar193);
      lVar24 = (long)iVar98 * 0x44;
      auVar193 = vmovshdup_avx(auVar185);
      uVar105 = auVar193._0_8_;
      local_5a0._8_8_ = uVar105;
      local_5a0._0_8_ = uVar105;
      local_5a0._16_8_ = uVar105;
      local_5a0._24_8_ = uVar105;
      auVar121 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      auVar193 = vmovshdup_avx(auVar186);
      uVar105 = auVar193._0_8_;
      local_5c0._8_8_ = uVar105;
      local_5c0._0_8_ = uVar105;
      local_5c0._16_8_ = uVar105;
      local_5c0._24_8_ = uVar105;
      auVar178 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      uVar210 = auVar194._0_4_;
      local_7c0._4_4_ = uVar210;
      local_7c0._0_4_ = uVar210;
      local_7c0._8_4_ = uVar210;
      local_7c0._12_4_ = uVar210;
      local_7c0._16_4_ = uVar210;
      local_7c0._20_4_ = uVar210;
      local_7c0._24_4_ = uVar210;
      local_7c0._28_4_ = uVar210;
      auVar193 = vmovshdup_avx(auVar194);
      uVar105 = auVar193._0_8_;
      local_6e0._8_8_ = uVar105;
      local_6e0._0_8_ = uVar105;
      local_6e0._16_8_ = uVar105;
      local_6e0._24_8_ = uVar105;
      local_4e0 = *(float *)(catmullrom_basis0 + lVar24 + 0xd8c);
      fStack_4dc = *(float *)(catmullrom_basis0 + lVar24 + 0xd90);
      fStack_4d8 = *(float *)(catmullrom_basis0 + lVar24 + 0xd94);
      fStack_4d4 = *(float *)(catmullrom_basis0 + lVar24 + 0xd98);
      fStack_4d0 = *(float *)(catmullrom_basis0 + lVar24 + 0xd9c);
      fStack_4cc = *(float *)(catmullrom_basis0 + lVar24 + 0xda0);
      fStack_4c8 = *(float *)(catmullrom_basis0 + lVar24 + 0xda4);
      iStack_4c4 = *(int *)(catmullrom_basis0 + lVar24 + 0xda8);
      local_580 = auVar195._0_4_;
      auVar193 = vmovshdup_avx(auVar195);
      uVar105 = auVar193._0_8_;
      auVar187._0_4_ = local_4e0 * local_580;
      auVar187._4_4_ = fStack_4dc * local_580;
      auVar187._8_4_ = fStack_4d8 * local_580;
      auVar187._12_4_ = fStack_4d4 * local_580;
      auVar187._16_4_ = fStack_4d0 * local_580;
      auVar187._20_4_ = fStack_4cc * local_580;
      auVar187._24_4_ = fStack_4c8 * local_580;
      auVar187._28_4_ = 0;
      local_7a0 = auVar193._0_4_;
      auVar110._0_4_ = local_7a0 * local_4e0;
      fStack_79c = auVar193._4_4_;
      auVar110._4_4_ = fStack_79c * fStack_4dc;
      auVar110._8_4_ = local_7a0 * fStack_4d8;
      auVar110._12_4_ = fStack_79c * fStack_4d4;
      auVar110._16_4_ = local_7a0 * fStack_4d0;
      auVar110._20_4_ = fStack_79c * fStack_4cc;
      auVar110._24_4_ = local_7a0 * fStack_4c8;
      auVar110._28_4_ = 0;
      auVar193 = vfmadd231ps_fma(auVar187,auVar178,local_7c0);
      auVar21 = vfmadd231ps_fma(auVar110,auVar178,local_6e0);
      uVar104 = auVar186._0_4_;
      auVar232._4_4_ = uVar104;
      auVar232._0_4_ = uVar104;
      auVar232._8_4_ = uVar104;
      auVar232._12_4_ = uVar104;
      auVar232._16_4_ = uVar104;
      auVar232._20_4_ = uVar104;
      auVar232._24_4_ = uVar104;
      auVar232._28_4_ = uVar104;
      auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar121,auVar232);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar121,local_5c0);
      auVar117 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      uVar104 = auVar185._0_4_;
      auVar227._4_4_ = uVar104;
      auVar227._0_4_ = uVar104;
      auVar227._8_4_ = uVar104;
      auVar227._12_4_ = uVar104;
      auVar227._16_4_ = uVar104;
      auVar227._20_4_ = uVar104;
      auVar227._24_4_ = uVar104;
      auVar227._28_4_ = uVar104;
      auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar117,auVar227);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar117,local_5a0);
      auVar132 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      fVar179 = *(float *)(catmullrom_basis1 + lVar24 + 0xd8c);
      fVar180 = *(float *)(catmullrom_basis1 + lVar24 + 0xd90);
      fVar181 = *(float *)(catmullrom_basis1 + lVar24 + 0xd94);
      fVar182 = *(float *)(catmullrom_basis1 + lVar24 + 0xd98);
      fVar183 = *(float *)(catmullrom_basis1 + lVar24 + 0xd9c);
      fVar184 = *(float *)(catmullrom_basis1 + lVar24 + 0xda0);
      fVar87 = *(float *)(catmullrom_basis1 + lVar24 + 0xda4);
      auVar27._4_4_ = local_580 * fVar180;
      auVar27._0_4_ = local_580 * fVar179;
      auVar27._8_4_ = local_580 * fVar181;
      auVar27._12_4_ = local_580 * fVar182;
      auVar27._16_4_ = local_580 * fVar183;
      auVar27._20_4_ = local_580 * fVar184;
      auVar27._24_4_ = local_580 * fVar87;
      auVar27._28_4_ = local_580;
      auVar149 = vfmadd231ps_fma(auVar27,auVar132,local_7c0);
      auVar28._4_4_ = fStack_79c * fVar180;
      auVar28._0_4_ = local_7a0 * fVar179;
      auVar28._8_4_ = local_7a0 * fVar181;
      auVar28._12_4_ = fStack_79c * fVar182;
      auVar28._16_4_ = local_7a0 * fVar183;
      auVar28._20_4_ = fStack_79c * fVar184;
      auVar28._24_4_ = local_7a0 * fVar87;
      auVar28._28_4_ = uVar210;
      auVar165 = vfmadd231ps_fma(auVar28,auVar132,local_6e0);
      auVar205 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar205,auVar232);
      auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar205,local_5c0);
      auVar174 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar174,auVar227);
      auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar174,local_5a0);
      auVar127 = ZEXT1632(auVar149);
      local_4a0 = ZEXT1632(auVar193);
      auVar23 = vsubps_avx(auVar127,local_4a0);
      local_480 = ZEXT1632(auVar165);
      auVar111 = ZEXT1632(auVar21);
      local_4c0 = vsubps_avx(local_480,auVar111);
      auVar112._0_4_ = auVar23._0_4_ * auVar21._0_4_;
      auVar112._4_4_ = auVar23._4_4_ * auVar21._4_4_;
      auVar112._8_4_ = auVar23._8_4_ * auVar21._8_4_;
      auVar112._12_4_ = auVar23._12_4_ * auVar21._12_4_;
      auVar112._16_4_ = auVar23._16_4_ * 0.0;
      auVar112._20_4_ = auVar23._20_4_ * 0.0;
      auVar112._24_4_ = auVar23._24_4_ * 0.0;
      auVar112._28_4_ = 0;
      fVar214 = local_4c0._0_4_;
      auVar128._0_4_ = fVar214 * auVar193._0_4_;
      fVar218 = local_4c0._4_4_;
      auVar128._4_4_ = fVar218 * auVar193._4_4_;
      fVar220 = local_4c0._8_4_;
      auVar128._8_4_ = fVar220 * auVar193._8_4_;
      fVar221 = local_4c0._12_4_;
      auVar128._12_4_ = fVar221 * auVar193._12_4_;
      fVar222 = local_4c0._16_4_;
      auVar128._16_4_ = fVar222 * 0.0;
      fVar223 = local_4c0._20_4_;
      auVar128._20_4_ = fVar223 * 0.0;
      fVar224 = local_4c0._24_4_;
      auVar128._24_4_ = fVar224 * 0.0;
      auVar128._28_4_ = 0;
      auVar22 = vsubps_avx(auVar112,auVar128);
      auVar193 = vpermilps_avx(*pauVar1,0xff);
      uVar124 = auVar193._0_8_;
      local_a0._8_8_ = uVar124;
      local_a0._0_8_ = uVar124;
      local_a0._16_8_ = uVar124;
      local_a0._24_8_ = uVar124;
      auVar21 = vpermilps_avx(*pauVar2,0xff);
      uVar124 = auVar21._0_8_;
      local_c0._8_8_ = uVar124;
      local_c0._0_8_ = uVar124;
      local_c0._16_8_ = uVar124;
      local_c0._24_8_ = uVar124;
      auVar21 = vpermilps_avx(*pauVar3,0xff);
      uVar124 = auVar21._0_8_;
      local_e0._8_8_ = uVar124;
      local_e0._0_8_ = uVar124;
      local_e0._16_8_ = uVar124;
      local_e0._24_8_ = uVar124;
      auVar21._12_4_ = fStack_8d4;
      auVar21._0_12_ = *pauVar4;
      auVar21 = vpermilps_avx(auVar21,0xff);
      local_100 = auVar21._0_8_;
      fVar142 = auVar21._0_4_;
      auVar188._0_4_ = local_4e0 * fVar142;
      fVar141 = auVar21._4_4_;
      auVar188._4_4_ = fStack_4dc * fVar141;
      auVar188._8_4_ = fStack_4d8 * fVar142;
      auVar188._12_4_ = fStack_4d4 * fVar141;
      auVar188._16_4_ = fStack_4d0 * fVar142;
      auVar188._20_4_ = fStack_4cc * fVar141;
      auVar188._24_4_ = fStack_4c8 * fVar142;
      auVar188._28_4_ = 0;
      auVar21 = vfmadd231ps_fma(auVar188,local_e0,auVar178);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_c0,auVar121);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar117,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar29._4_4_ = fVar141 * fVar180;
      auVar29._0_4_ = fVar142 * fVar179;
      auVar29._8_4_ = fVar142 * fVar181;
      auVar29._12_4_ = fVar141 * fVar182;
      auVar29._16_4_ = fVar142 * fVar183;
      auVar29._20_4_ = fVar141 * fVar184;
      auVar29._24_4_ = fVar142 * fVar87;
      auVar29._28_4_ = auVar117._28_4_;
      auVar149 = vfmadd231ps_fma(auVar29,auVar132,local_e0);
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar205,local_c0);
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar174,local_a0);
      auVar30._4_4_ = fVar218 * fVar218;
      auVar30._0_4_ = fVar214 * fVar214;
      auVar30._8_4_ = fVar220 * fVar220;
      auVar30._12_4_ = fVar221 * fVar221;
      auVar30._16_4_ = fVar222 * fVar222;
      auVar30._20_4_ = fVar223 * fVar223;
      auVar30._24_4_ = fVar224 * fVar224;
      auVar30._28_4_ = auVar193._4_4_;
      auVar193 = vfmadd231ps_fma(auVar30,auVar23,auVar23);
      auVar154 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar149));
      auVar31._4_4_ = auVar154._4_4_ * auVar154._4_4_ * auVar193._4_4_;
      auVar31._0_4_ = auVar154._0_4_ * auVar154._0_4_ * auVar193._0_4_;
      auVar31._8_4_ = auVar154._8_4_ * auVar154._8_4_ * auVar193._8_4_;
      auVar31._12_4_ = auVar154._12_4_ * auVar154._12_4_ * auVar193._12_4_;
      auVar31._16_4_ = auVar154._16_4_ * auVar154._16_4_ * 0.0;
      auVar31._20_4_ = auVar154._20_4_ * auVar154._20_4_ * 0.0;
      auVar31._24_4_ = auVar154._24_4_ * auVar154._24_4_ * 0.0;
      auVar31._28_4_ = auVar154._28_4_;
      auVar32._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar32._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar32._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar32._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar32._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar32._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar32._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar32._28_4_ = auVar22._28_4_;
      auVar154 = vcmpps_avx(auVar32,auVar31,2);
      fVar142 = auVar106._0_4_ * 4.7683716e-07;
      auVar113._0_4_ = (float)iVar98;
      local_5e0._4_12_ = auVar194._4_12_;
      local_5e0._0_4_ = auVar113._0_4_;
      local_5e0._16_16_ = auVar119._16_16_;
      auVar113._4_4_ = auVar113._0_4_;
      auVar113._8_4_ = auVar113._0_4_;
      auVar113._12_4_ = auVar113._0_4_;
      auVar113._16_4_ = auVar113._0_4_;
      auVar113._20_4_ = auVar113._0_4_;
      auVar113._24_4_ = auVar113._0_4_;
      auVar113._28_4_ = auVar113._0_4_;
      auVar119 = vcmpps_avx(_DAT_01faff40,auVar113,1);
      auVar106 = vpermilps_avx(auVar185,0xaa);
      uVar124 = auVar106._0_8_;
      local_660._8_8_ = uVar124;
      local_660._0_8_ = uVar124;
      local_660._16_8_ = uVar124;
      local_660._24_8_ = uVar124;
      auVar106 = vpermilps_avx(auVar186,0xaa);
      uVar124 = auVar106._0_8_;
      auVar162._8_8_ = uVar124;
      auVar162._0_8_ = uVar124;
      auVar162._16_8_ = uVar124;
      auVar162._24_8_ = uVar124;
      auVar106 = vshufps_avx(auVar194,auVar194,0xaa);
      uVar124 = auVar106._0_8_;
      auVar212._8_8_ = uVar124;
      auVar212._0_8_ = uVar124;
      auVar212._16_8_ = uVar124;
      auVar212._24_8_ = uVar124;
      auVar106 = vshufps_avx(auVar195,auVar195,0xaa);
      uVar124 = auVar106._0_8_;
      register0x00001508 = uVar124;
      local_760 = uVar124;
      register0x00001510 = uVar124;
      register0x00001518 = uVar124;
      auVar217 = ZEXT3264(_local_760);
      auVar22 = auVar119 & auVar154;
      uVar7 = *(uint *)(ray + k * 4 + 0x60);
      local_740._0_16_ = ZEXT416(uVar7);
      fStack_798 = local_7a0;
      fStack_794 = fStack_79c;
      fStack_790 = local_7a0;
      fStack_78c = fStack_79c;
      fStack_788 = local_7a0;
      fStack_784 = fStack_79c;
      fStack_57c = local_580;
      fStack_578 = local_580;
      fStack_574 = local_580;
      fStack_570 = local_580;
      fStack_56c = local_580;
      fStack_568 = local_580;
      fStack_564 = local_580;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0x7f,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0xbf,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
      {
        auVar200 = ZEXT3264(CONCAT428(fStack_79c,
                                      CONCAT424(local_7a0,
                                                CONCAT420(fStack_79c,
                                                          CONCAT416(local_7a0,
                                                                    CONCAT412(fStack_79c,
                                                                              CONCAT48(local_7a0,
                                                                                       uVar105))))))
                           );
      }
      else {
        _local_500 = vandps_avx(auVar154,auVar119);
        fVar214 = auVar106._0_4_;
        fVar218 = auVar106._4_4_;
        auVar33._4_4_ = fVar218 * fVar180;
        auVar33._0_4_ = fVar214 * fVar179;
        auVar33._8_4_ = fVar214 * fVar181;
        auVar33._12_4_ = fVar218 * fVar182;
        auVar33._16_4_ = fVar214 * fVar183;
        auVar33._20_4_ = fVar218 * fVar184;
        auVar33._24_4_ = fVar214 * fVar87;
        auVar33._28_4_ = local_500._28_4_;
        auVar106 = vfmadd213ps_fma(auVar132,auVar212,auVar33);
        auVar106 = vfmadd213ps_fma(auVar205,auVar162,ZEXT1632(auVar106));
        auVar106 = vfmadd213ps_fma(auVar174,local_660,ZEXT1632(auVar106));
        local_520 = ZEXT1632(auVar106);
        auVar34._4_4_ = fVar218 * fStack_4dc;
        auVar34._0_4_ = fVar214 * local_4e0;
        auVar34._8_4_ = fVar214 * fStack_4d8;
        auVar34._12_4_ = fVar218 * fStack_4d4;
        auVar34._16_4_ = fVar214 * fStack_4d0;
        auVar34._20_4_ = fVar218 * fStack_4cc;
        auVar34._24_4_ = fVar214 * fStack_4c8;
        auVar34._28_4_ = local_500._28_4_;
        auVar106 = vfmadd213ps_fma(auVar178,auVar212,auVar34);
        auVar106 = vfmadd213ps_fma(auVar121,auVar162,ZEXT1632(auVar106));
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar121 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar178 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        fVar141 = *(float *)(catmullrom_basis0 + lVar24 + 0x1f9c);
        fVar179 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa0);
        fVar180 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa4);
        fVar181 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa8);
        fVar182 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fac);
        fVar183 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb0);
        fVar184 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb4);
        auVar173._0_4_ = local_580 * fVar141;
        auVar173._4_4_ = local_580 * fVar179;
        auVar173._8_4_ = local_580 * fVar180;
        auVar173._12_4_ = local_580 * fVar181;
        auVar173._16_4_ = local_580 * fVar182;
        auVar173._20_4_ = local_580 * fVar183;
        auVar173._24_4_ = local_580 * fVar184;
        auVar173._28_4_ = 0;
        auVar197._0_4_ = local_7a0 * fVar141;
        auVar197._4_4_ = fStack_79c * fVar179;
        auVar197._8_4_ = local_7a0 * fVar180;
        auVar197._12_4_ = fStack_79c * fVar181;
        auVar197._16_4_ = local_7a0 * fVar182;
        auVar197._20_4_ = fStack_79c * fVar183;
        auVar197._24_4_ = local_7a0 * fVar184;
        auVar197._28_4_ = 0;
        auVar207._0_4_ = fVar141 * fVar214;
        auVar207._4_4_ = fVar179 * fVar218;
        auVar207._8_4_ = fVar180 * fVar214;
        auVar207._12_4_ = fVar181 * fVar218;
        auVar207._16_4_ = fVar182 * fVar214;
        auVar207._20_4_ = fVar183 * fVar218;
        auVar207._24_4_ = fVar184 * fVar214;
        auVar207._28_4_ = 0;
        auVar193 = vfmadd231ps_fma(auVar173,auVar178,local_7c0);
        auVar165 = vfmadd231ps_fma(auVar197,auVar178,local_6e0);
        auVar185 = vfmadd231ps_fma(auVar207,auVar212,auVar178);
        auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar121,auVar232);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar121,local_5c0);
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar162,auVar121);
        auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar119,auVar227);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar119,local_5a0);
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar119,local_660);
        fVar141 = *(float *)(catmullrom_basis1 + lVar24 + 0x1f9c);
        fVar179 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa0);
        fVar180 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa4);
        fVar181 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa8);
        fVar182 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fac);
        fVar183 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb0);
        fVar184 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb4);
        auVar121._4_4_ = local_580 * fVar179;
        auVar121._0_4_ = local_580 * fVar141;
        auVar121._8_4_ = local_580 * fVar180;
        auVar121._12_4_ = local_580 * fVar181;
        auVar121._16_4_ = local_580 * fVar182;
        auVar121._20_4_ = local_580 * fVar183;
        auVar121._24_4_ = local_580 * fVar184;
        auVar121._28_4_ = local_580;
        auVar35._4_4_ = fStack_79c * fVar179;
        auVar35._0_4_ = local_7a0 * fVar141;
        auVar35._8_4_ = local_7a0 * fVar180;
        auVar35._12_4_ = fStack_79c * fVar181;
        auVar35._16_4_ = local_7a0 * fVar182;
        auVar35._20_4_ = fStack_79c * fVar183;
        auVar35._24_4_ = local_7a0 * fVar184;
        auVar35._28_4_ = fStack_79c;
        auVar36._4_4_ = fVar218 * fVar179;
        auVar36._0_4_ = fVar214 * fVar141;
        auVar36._8_4_ = fVar214 * fVar180;
        auVar36._12_4_ = fVar218 * fVar181;
        auVar36._16_4_ = fVar214 * fVar182;
        auVar36._20_4_ = fVar218 * fVar183;
        auVar36._24_4_ = fVar214 * fVar184;
        auVar36._28_4_ = fVar218;
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar186 = vfmadd231ps_fma(auVar121,auVar119,local_7c0);
        auVar194 = vfmadd231ps_fma(auVar35,auVar119,local_6e0);
        auVar195 = vfmadd231ps_fma(auVar36,auVar212,auVar119);
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar119,auVar232);
        auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar119,local_5c0);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar119,auVar162);
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar119,auVar227);
        auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar119,local_5a0);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),local_660,auVar119);
        auVar119 = vandps_avx(local_2e0,ZEXT1632(auVar193));
        auVar121 = vandps_avx(ZEXT1632(auVar165),local_2e0);
        auVar121 = vmaxps_avx(auVar119,auVar121);
        auVar119 = vandps_avx(ZEXT1632(auVar185),local_2e0);
        auVar119 = vmaxps_avx(auVar121,auVar119);
        auVar129._4_4_ = fVar142;
        auVar129._0_4_ = fVar142;
        auVar129._8_4_ = fVar142;
        auVar129._12_4_ = fVar142;
        auVar129._16_4_ = fVar142;
        auVar129._20_4_ = fVar142;
        auVar129._24_4_ = fVar142;
        auVar129._28_4_ = fVar142;
        auVar119 = vcmpps_avx(auVar119,auVar129,1);
        auVar178 = vblendvps_avx(ZEXT1632(auVar193),auVar23,auVar119);
        auVar132 = vblendvps_avx(ZEXT1632(auVar165),local_4c0,auVar119);
        auVar119 = vandps_avx(ZEXT1632(auVar186),local_2e0);
        auVar121 = vandps_avx(ZEXT1632(auVar194),local_2e0);
        auVar121 = vmaxps_avx(auVar119,auVar121);
        auVar119 = vandps_avx(ZEXT1632(auVar195),local_2e0);
        auVar119 = vmaxps_avx(auVar121,auVar119);
        auVar121 = vcmpps_avx(auVar119,auVar129,1);
        auVar119 = vblendvps_avx(ZEXT1632(auVar186),auVar23,auVar121);
        auVar121 = vblendvps_avx(ZEXT1632(auVar194),local_4c0,auVar121);
        auVar106 = vfmadd213ps_fma(auVar117,local_660,ZEXT1632(auVar106));
        auVar193 = vfmadd213ps_fma(auVar178,auVar178,ZEXT832(0) << 0x20);
        auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar132,auVar132);
        auVar117 = vrsqrtps_avx(ZEXT1632(auVar193));
        fVar141 = auVar117._0_4_;
        fVar179 = auVar117._4_4_;
        fVar180 = auVar117._8_4_;
        fVar181 = auVar117._12_4_;
        fVar182 = auVar117._16_4_;
        fVar183 = auVar117._20_4_;
        fVar184 = auVar117._24_4_;
        auVar37._4_4_ = fVar179 * fVar179 * fVar179 * auVar193._4_4_ * -0.5;
        auVar37._0_4_ = fVar141 * fVar141 * fVar141 * auVar193._0_4_ * -0.5;
        auVar37._8_4_ = fVar180 * fVar180 * fVar180 * auVar193._8_4_ * -0.5;
        auVar37._12_4_ = fVar181 * fVar181 * fVar181 * auVar193._12_4_ * -0.5;
        auVar37._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar37._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar37._24_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar37._28_4_ = 0;
        auVar228._8_4_ = 0x3fc00000;
        auVar228._0_8_ = 0x3fc000003fc00000;
        auVar228._12_4_ = 0x3fc00000;
        auVar228._16_4_ = 0x3fc00000;
        auVar228._20_4_ = 0x3fc00000;
        auVar228._24_4_ = 0x3fc00000;
        auVar228._28_4_ = 0x3fc00000;
        auVar193 = vfmadd231ps_fma(auVar37,auVar228,auVar117);
        fVar141 = auVar193._0_4_;
        fVar179 = auVar193._4_4_;
        auVar38._4_4_ = auVar132._4_4_ * fVar179;
        auVar38._0_4_ = auVar132._0_4_ * fVar141;
        fVar180 = auVar193._8_4_;
        auVar38._8_4_ = auVar132._8_4_ * fVar180;
        fVar181 = auVar193._12_4_;
        auVar38._12_4_ = auVar132._12_4_ * fVar181;
        auVar38._16_4_ = auVar132._16_4_ * 0.0;
        auVar38._20_4_ = auVar132._20_4_ * 0.0;
        auVar38._24_4_ = auVar132._24_4_ * 0.0;
        auVar38._28_4_ = auVar117._28_4_;
        auVar39._4_4_ = -auVar178._4_4_ * fVar179;
        auVar39._0_4_ = -auVar178._0_4_ * fVar141;
        auVar39._8_4_ = -auVar178._8_4_ * fVar180;
        auVar39._12_4_ = -auVar178._12_4_ * fVar181;
        auVar39._16_4_ = -auVar178._16_4_ * 0.0;
        auVar39._20_4_ = -auVar178._20_4_ * 0.0;
        auVar39._24_4_ = -auVar178._24_4_ * 0.0;
        auVar39._28_4_ = auVar178._28_4_ ^ 0x80000000;
        auVar193 = vfmadd213ps_fma(auVar119,auVar119,ZEXT832(0) << 0x20);
        auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar121,auVar121);
        auVar178 = vrsqrtps_avx(ZEXT1632(auVar193));
        auVar117 = ZEXT1632(CONCAT412(fVar181 * 0.0,
                                      CONCAT48(fVar180 * 0.0,CONCAT44(fVar179 * 0.0,fVar141 * 0.0)))
                           );
        fVar141 = auVar178._0_4_;
        fVar179 = auVar178._4_4_;
        fVar180 = auVar178._8_4_;
        fVar181 = auVar178._12_4_;
        fVar182 = auVar178._16_4_;
        fVar183 = auVar178._20_4_;
        fVar184 = auVar178._24_4_;
        auVar40._4_4_ = fVar179 * fVar179 * auVar193._4_4_ * -0.5 * fVar179;
        auVar40._0_4_ = fVar141 * fVar141 * auVar193._0_4_ * -0.5 * fVar141;
        auVar40._8_4_ = fVar180 * fVar180 * auVar193._8_4_ * -0.5 * fVar180;
        auVar40._12_4_ = fVar181 * fVar181 * auVar193._12_4_ * -0.5 * fVar181;
        auVar40._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar40._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar40._24_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar40._28_4_ = 0xbf000000;
        auVar193 = vfmadd231ps_fma(auVar40,auVar228,auVar178);
        fVar141 = auVar193._0_4_;
        fVar179 = auVar193._4_4_;
        auVar41._4_4_ = fVar179 * auVar121._4_4_;
        auVar41._0_4_ = fVar141 * auVar121._0_4_;
        fVar180 = auVar193._8_4_;
        auVar41._8_4_ = fVar180 * auVar121._8_4_;
        fVar181 = auVar193._12_4_;
        auVar41._12_4_ = fVar181 * auVar121._12_4_;
        auVar41._16_4_ = auVar121._16_4_ * 0.0;
        auVar41._20_4_ = auVar121._20_4_ * 0.0;
        auVar41._24_4_ = auVar121._24_4_ * 0.0;
        auVar41._28_4_ = auVar23._28_4_;
        auVar42._4_4_ = fVar179 * -auVar119._4_4_;
        auVar42._0_4_ = fVar141 * -auVar119._0_4_;
        auVar42._8_4_ = fVar180 * -auVar119._8_4_;
        auVar42._12_4_ = fVar181 * -auVar119._12_4_;
        auVar42._16_4_ = -auVar119._16_4_ * 0.0;
        auVar42._20_4_ = -auVar119._20_4_ * 0.0;
        auVar42._24_4_ = -auVar119._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar43._28_4_ = auVar178._28_4_;
        auVar43._0_28_ =
             ZEXT1628(CONCAT412(fVar181 * 0.0,
                                CONCAT48(fVar180 * 0.0,CONCAT44(fVar179 * 0.0,fVar141 * 0.0))));
        auVar193 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar21),local_4a0);
        auVar119 = ZEXT1632(auVar21);
        auVar165 = vfmadd213ps_fma(auVar39,auVar119,auVar111);
        auVar185 = vfmadd213ps_fma(auVar117,auVar119,ZEXT1632(auVar106));
        auVar195 = vfnmadd213ps_fma(auVar38,auVar119,local_4a0);
        auVar186 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar149),auVar127);
        auVar25 = vfnmadd213ps_fma(auVar39,auVar119,auVar111);
        auVar119 = ZEXT1632(auVar149);
        auVar194 = vfmadd213ps_fma(auVar42,auVar119,local_480);
        auVar189 = ZEXT1632(auVar21);
        auVar211 = vfnmadd231ps_fma(ZEXT1632(auVar106),auVar189,auVar117);
        auVar21 = vfmadd213ps_fma(auVar43,auVar119,local_520);
        auVar26 = vfnmadd213ps_fma(auVar41,auVar119,auVar127);
        auVar206 = vfnmadd213ps_fma(auVar42,auVar119,local_480);
        local_600 = ZEXT1632(auVar149);
        auVar215 = vfnmadd231ps_fma(local_520,local_600,auVar43);
        auVar119 = vsubps_avx(ZEXT1632(auVar194),ZEXT1632(auVar25));
        auVar121 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar211));
        auVar152._0_4_ = auVar211._0_4_ * auVar119._0_4_;
        auVar152._4_4_ = auVar211._4_4_ * auVar119._4_4_;
        auVar152._8_4_ = auVar211._8_4_ * auVar119._8_4_;
        auVar152._12_4_ = auVar211._12_4_ * auVar119._12_4_;
        auVar152._16_4_ = auVar119._16_4_ * 0.0;
        auVar152._20_4_ = auVar119._20_4_ * 0.0;
        auVar152._24_4_ = auVar119._24_4_ * 0.0;
        auVar152._28_4_ = 0;
        auVar149 = vfmsub231ps_fma(auVar152,ZEXT1632(auVar25),auVar121);
        auVar44._4_4_ = auVar121._4_4_ * auVar195._4_4_;
        auVar44._0_4_ = auVar121._0_4_ * auVar195._0_4_;
        auVar44._8_4_ = auVar121._8_4_ * auVar195._8_4_;
        auVar44._12_4_ = auVar121._12_4_ * auVar195._12_4_;
        auVar44._16_4_ = auVar121._16_4_ * 0.0;
        auVar44._20_4_ = auVar121._20_4_ * 0.0;
        auVar44._24_4_ = auVar121._24_4_ * 0.0;
        auVar44._28_4_ = auVar121._28_4_;
        auVar121 = vsubps_avx(ZEXT1632(auVar186),ZEXT1632(auVar195));
        auVar106 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar211),auVar121);
        auVar45._4_4_ = auVar25._4_4_ * auVar121._4_4_;
        auVar45._0_4_ = auVar25._0_4_ * auVar121._0_4_;
        auVar45._8_4_ = auVar25._8_4_ * auVar121._8_4_;
        auVar45._12_4_ = auVar25._12_4_ * auVar121._12_4_;
        auVar45._16_4_ = auVar121._16_4_ * 0.0;
        auVar45._20_4_ = auVar121._20_4_ * 0.0;
        auVar45._24_4_ = auVar121._24_4_ * 0.0;
        auVar45._28_4_ = auVar121._28_4_;
        auVar174 = ZEXT1632(auVar195);
        auVar195 = vfmsub231ps_fma(auVar45,auVar174,auVar119);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar195),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar149));
        auVar22 = vcmpps_avx(ZEXT1632(auVar106),ZEXT832(0) << 0x20,2);
        auVar119 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar193),auVar22);
        auVar121 = vblendvps_avx(ZEXT1632(auVar206),ZEXT1632(auVar165),auVar22);
        auVar178 = vblendvps_avx(ZEXT1632(auVar215),ZEXT1632(auVar185),auVar22);
        auVar117 = vblendvps_avx(auVar174,ZEXT1632(auVar186),auVar22);
        auVar132 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar194),auVar22);
        auVar205 = vblendvps_avx(ZEXT1632(auVar211),ZEXT1632(auVar21),auVar22);
        auVar174 = vblendvps_avx(ZEXT1632(auVar186),auVar174,auVar22);
        auVar154 = vblendvps_avx(ZEXT1632(auVar194),ZEXT1632(auVar25),auVar22);
        auVar106 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
        auVar23 = vblendvps_avx(ZEXT1632(auVar21),ZEXT1632(auVar211),auVar22);
        auVar111 = vsubps_avx(auVar174,auVar119);
        auVar127 = vsubps_avx(auVar154,auVar121);
        auVar151 = vsubps_avx(auVar23,auVar178);
        auVar120 = vsubps_avx(auVar119,auVar117);
        auVar172 = vsubps_avx(auVar121,auVar132);
        auVar196 = vsubps_avx(auVar178,auVar205);
        auVar46._4_4_ = auVar151._4_4_ * auVar119._4_4_;
        auVar46._0_4_ = auVar151._0_4_ * auVar119._0_4_;
        auVar46._8_4_ = auVar151._8_4_ * auVar119._8_4_;
        auVar46._12_4_ = auVar151._12_4_ * auVar119._12_4_;
        auVar46._16_4_ = auVar151._16_4_ * auVar119._16_4_;
        auVar46._20_4_ = auVar151._20_4_ * auVar119._20_4_;
        auVar46._24_4_ = auVar151._24_4_ * auVar119._24_4_;
        auVar46._28_4_ = auVar23._28_4_;
        auVar193 = vfmsub231ps_fma(auVar46,auVar178,auVar111);
        auVar47._4_4_ = auVar121._4_4_ * auVar111._4_4_;
        auVar47._0_4_ = auVar121._0_4_ * auVar111._0_4_;
        auVar47._8_4_ = auVar121._8_4_ * auVar111._8_4_;
        auVar47._12_4_ = auVar121._12_4_ * auVar111._12_4_;
        auVar47._16_4_ = auVar121._16_4_ * auVar111._16_4_;
        auVar47._20_4_ = auVar121._20_4_ * auVar111._20_4_;
        auVar47._24_4_ = auVar121._24_4_ * auVar111._24_4_;
        auVar47._28_4_ = auVar174._28_4_;
        auVar21 = vfmsub231ps_fma(auVar47,auVar119,auVar127);
        auVar193 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar193));
        auVar114._0_4_ = auVar127._0_4_ * auVar178._0_4_;
        auVar114._4_4_ = auVar127._4_4_ * auVar178._4_4_;
        auVar114._8_4_ = auVar127._8_4_ * auVar178._8_4_;
        auVar114._12_4_ = auVar127._12_4_ * auVar178._12_4_;
        auVar114._16_4_ = auVar127._16_4_ * auVar178._16_4_;
        auVar114._20_4_ = auVar127._20_4_ * auVar178._20_4_;
        auVar114._24_4_ = auVar127._24_4_ * auVar178._24_4_;
        auVar114._28_4_ = 0;
        auVar21 = vfmsub231ps_fma(auVar114,auVar121,auVar151);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar193),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar115._0_4_ = auVar196._0_4_ * auVar117._0_4_;
        auVar115._4_4_ = auVar196._4_4_ * auVar117._4_4_;
        auVar115._8_4_ = auVar196._8_4_ * auVar117._8_4_;
        auVar115._12_4_ = auVar196._12_4_ * auVar117._12_4_;
        auVar115._16_4_ = auVar196._16_4_ * auVar117._16_4_;
        auVar115._20_4_ = auVar196._20_4_ * auVar117._20_4_;
        auVar115._24_4_ = auVar196._24_4_ * auVar117._24_4_;
        auVar115._28_4_ = 0;
        auVar193 = vfmsub231ps_fma(auVar115,auVar120,auVar205);
        auVar48._4_4_ = auVar172._4_4_ * auVar205._4_4_;
        auVar48._0_4_ = auVar172._0_4_ * auVar205._0_4_;
        auVar48._8_4_ = auVar172._8_4_ * auVar205._8_4_;
        auVar48._12_4_ = auVar172._12_4_ * auVar205._12_4_;
        auVar48._16_4_ = auVar172._16_4_ * auVar205._16_4_;
        auVar48._20_4_ = auVar172._20_4_ * auVar205._20_4_;
        auVar48._24_4_ = auVar172._24_4_ * auVar205._24_4_;
        auVar48._28_4_ = auVar205._28_4_;
        auVar149 = vfmsub231ps_fma(auVar48,auVar132,auVar196);
        auVar49._4_4_ = auVar120._4_4_ * auVar132._4_4_;
        auVar49._0_4_ = auVar120._0_4_ * auVar132._0_4_;
        auVar49._8_4_ = auVar120._8_4_ * auVar132._8_4_;
        auVar49._12_4_ = auVar120._12_4_ * auVar132._12_4_;
        auVar49._16_4_ = auVar120._16_4_ * auVar132._16_4_;
        auVar49._20_4_ = auVar120._20_4_ * auVar132._20_4_;
        auVar49._24_4_ = auVar120._24_4_ * auVar132._24_4_;
        auVar49._28_4_ = auVar154._28_4_;
        auVar165 = vfmsub231ps_fma(auVar49,auVar172,auVar117);
        auVar193 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar193));
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar193),ZEXT832(0) << 0x20,ZEXT1632(auVar149));
        auVar117 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar149));
        auVar117 = vcmpps_avx(auVar117,ZEXT832(0) << 0x20,2);
        auVar193 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar106 = vpand_avx(auVar193,auVar106);
        auVar117 = vpmovsxwd_avx2(auVar106);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) {
LAB_017f5a0f:
          auVar171._8_8_ = local_6a0[1]._8_8_;
          auVar171._0_8_ = local_6a0[1]._0_8_;
          auVar171._16_8_ = local_6a0[1]._16_8_;
          auVar171._24_8_ = local_6a0[1]._24_8_;
          auVar202._8_4_ = local_7a0;
          auVar202._0_8_ = uVar105;
          auVar202._12_4_ = fStack_79c;
          auVar202._16_4_ = local_7a0;
          auVar202._20_4_ = fStack_79c;
          auVar202._24_4_ = local_7a0;
          auVar202._28_4_ = fStack_79c;
        }
        else {
          auVar50._4_4_ = auVar127._4_4_ * auVar196._4_4_;
          auVar50._0_4_ = auVar127._0_4_ * auVar196._0_4_;
          auVar50._8_4_ = auVar127._8_4_ * auVar196._8_4_;
          auVar50._12_4_ = auVar127._12_4_ * auVar196._12_4_;
          auVar50._16_4_ = auVar127._16_4_ * auVar196._16_4_;
          auVar50._20_4_ = auVar127._20_4_ * auVar196._20_4_;
          auVar50._24_4_ = auVar127._24_4_ * auVar196._24_4_;
          auVar50._28_4_ = auVar117._28_4_;
          auVar186 = vfmsub231ps_fma(auVar50,auVar172,auVar151);
          auVar130._0_4_ = auVar151._0_4_ * auVar120._0_4_;
          auVar130._4_4_ = auVar151._4_4_ * auVar120._4_4_;
          auVar130._8_4_ = auVar151._8_4_ * auVar120._8_4_;
          auVar130._12_4_ = auVar151._12_4_ * auVar120._12_4_;
          auVar130._16_4_ = auVar151._16_4_ * auVar120._16_4_;
          auVar130._20_4_ = auVar151._20_4_ * auVar120._20_4_;
          auVar130._24_4_ = auVar151._24_4_ * auVar120._24_4_;
          auVar130._28_4_ = 0;
          auVar185 = vfmsub231ps_fma(auVar130,auVar111,auVar196);
          auVar51._4_4_ = auVar172._4_4_ * auVar111._4_4_;
          auVar51._0_4_ = auVar172._0_4_ * auVar111._0_4_;
          auVar51._8_4_ = auVar172._8_4_ * auVar111._8_4_;
          auVar51._12_4_ = auVar172._12_4_ * auVar111._12_4_;
          auVar51._16_4_ = auVar172._16_4_ * auVar111._16_4_;
          auVar51._20_4_ = auVar172._20_4_ * auVar111._20_4_;
          auVar51._24_4_ = auVar172._24_4_ * auVar111._24_4_;
          auVar51._28_4_ = auVar132._28_4_;
          auVar194 = vfmsub231ps_fma(auVar51,auVar120,auVar127);
          auVar193 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar185),ZEXT1632(auVar194));
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar193),ZEXT1632(auVar186),ZEXT832(0) << 0x20);
          auVar117 = vrcpps_avx(ZEXT1632(auVar165));
          auVar208._8_4_ = 0x3f800000;
          auVar208._0_8_ = 0x3f8000003f800000;
          auVar208._12_4_ = 0x3f800000;
          auVar208._16_4_ = 0x3f800000;
          auVar208._20_4_ = 0x3f800000;
          auVar208._24_4_ = 0x3f800000;
          auVar208._28_4_ = 0x3f800000;
          auVar193 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar165),auVar208);
          auVar193 = vfmadd132ps_fma(ZEXT1632(auVar193),auVar117,auVar117);
          auVar190._0_4_ = auVar194._0_4_ * auVar178._0_4_;
          auVar190._4_4_ = auVar194._4_4_ * auVar178._4_4_;
          auVar190._8_4_ = auVar194._8_4_ * auVar178._8_4_;
          auVar190._12_4_ = auVar194._12_4_ * auVar178._12_4_;
          auVar190._16_4_ = auVar178._16_4_ * 0.0;
          auVar190._20_4_ = auVar178._20_4_ * 0.0;
          auVar190._24_4_ = auVar178._24_4_ * 0.0;
          auVar190._28_4_ = 0;
          auVar185 = vfmadd231ps_fma(auVar190,auVar121,ZEXT1632(auVar185));
          auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),ZEXT1632(auVar186),auVar119);
          fVar141 = auVar193._0_4_;
          fVar179 = auVar193._4_4_;
          fVar180 = auVar193._8_4_;
          fVar181 = auVar193._12_4_;
          auVar178 = ZEXT1632(CONCAT412(fVar181 * auVar185._12_4_,
                                        CONCAT48(fVar180 * auVar185._8_4_,
                                                 CONCAT44(fVar179 * auVar185._4_4_,
                                                          fVar141 * auVar185._0_4_))));
          auVar116._4_4_ = uVar7;
          auVar116._0_4_ = uVar7;
          auVar116._8_4_ = uVar7;
          auVar116._12_4_ = uVar7;
          auVar116._16_4_ = uVar7;
          auVar116._20_4_ = uVar7;
          auVar116._24_4_ = uVar7;
          auVar116._28_4_ = uVar7;
          uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar131._4_4_ = uVar104;
          auVar131._0_4_ = uVar104;
          auVar131._8_4_ = uVar104;
          auVar131._12_4_ = uVar104;
          auVar131._16_4_ = uVar104;
          auVar131._20_4_ = uVar104;
          auVar131._24_4_ = uVar104;
          auVar131._28_4_ = uVar104;
          auVar119 = vcmpps_avx(auVar116,auVar178,2);
          auVar121 = vcmpps_avx(auVar178,auVar131,2);
          auVar119 = vandps_avx(auVar121,auVar119);
          auVar193 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
          auVar106 = vpand_avx(auVar106,auVar193);
          auVar119 = vpmovsxwd_avx2(auVar106);
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar119 >> 0x7f,0) == '\0') &&
                (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar119 >> 0xbf,0) == '\0') &&
              (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar119[0x1f]) goto LAB_017f5a0f;
          auVar119 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar165),4);
          auVar193 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
          auVar106 = vpand_avx(auVar106,auVar193);
          auVar119 = vpmovsxwd_avx2(auVar106);
          auVar171._8_8_ = local_6a0[1]._8_8_;
          auVar171._0_8_ = local_6a0[1]._0_8_;
          auVar171._16_8_ = local_6a0[1]._16_8_;
          auVar171._24_8_ = local_6a0[1]._24_8_;
          auVar202._8_4_ = local_7a0;
          auVar202._0_8_ = uVar105;
          auVar202._12_4_ = fStack_79c;
          auVar202._16_4_ = local_7a0;
          auVar202._20_4_ = fStack_79c;
          auVar202._24_4_ = local_7a0;
          auVar202._28_4_ = fStack_79c;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            auVar117 = ZEXT1632(CONCAT412(fVar181 * auVar21._12_4_,
                                          CONCAT48(fVar180 * auVar21._8_4_,
                                                   CONCAT44(fVar179 * auVar21._4_4_,
                                                            fVar141 * auVar21._0_4_))));
            auVar132 = ZEXT1632(CONCAT412(fVar181 * auVar149._12_4_,
                                          CONCAT48(fVar180 * auVar149._8_4_,
                                                   CONCAT44(fVar179 * auVar149._4_4_,
                                                            fVar141 * auVar149._0_4_))));
            auVar170._8_4_ = 0x3f800000;
            auVar170._0_8_ = 0x3f8000003f800000;
            auVar170._12_4_ = 0x3f800000;
            auVar170._16_4_ = 0x3f800000;
            auVar170._20_4_ = 0x3f800000;
            auVar170._24_4_ = 0x3f800000;
            auVar170._28_4_ = 0x3f800000;
            auVar121 = vsubps_avx(auVar170,auVar117);
            _local_2c0 = vblendvps_avx(auVar121,auVar117,auVar22);
            auVar121 = vsubps_avx(auVar170,auVar132);
            local_540 = vblendvps_avx(auVar121,auVar132,auVar22);
            auVar171 = auVar119;
            local_620 = auVar178;
          }
        }
        auVar217 = ZEXT3264(_local_760);
        auVar209 = ZEXT3264(auVar162);
        if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar171 >> 0x7f,0) != '\0') ||
              (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar171 >> 0xbf,0) != '\0') ||
            (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar171[0x1f] < '\0') {
          auVar119 = vsubps_avx(local_600,auVar189);
          auVar106 = vfmadd213ps_fma(auVar119,_local_2c0,auVar189);
          fVar141 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar52._4_4_ = (auVar106._4_4_ + auVar106._4_4_) * fVar141;
          auVar52._0_4_ = (auVar106._0_4_ + auVar106._0_4_) * fVar141;
          auVar52._8_4_ = (auVar106._8_4_ + auVar106._8_4_) * fVar141;
          auVar52._12_4_ = (auVar106._12_4_ + auVar106._12_4_) * fVar141;
          auVar52._16_4_ = fVar141 * 0.0;
          auVar52._20_4_ = fVar141 * 0.0;
          auVar52._24_4_ = fVar141 * 0.0;
          auVar52._28_4_ = 0;
          auVar119 = vcmpps_avx(local_620,auVar52,6);
          auVar121 = auVar171 & auVar119;
          auVar213 = ZEXT3264(auVar212);
          auVar200 = ZEXT3264(auVar202);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            auVar133._8_4_ = 0xbf800000;
            auVar133._0_8_ = 0xbf800000bf800000;
            auVar133._12_4_ = 0xbf800000;
            auVar133._16_4_ = 0xbf800000;
            auVar133._20_4_ = 0xbf800000;
            auVar133._24_4_ = 0xbf800000;
            auVar133._28_4_ = 0xbf800000;
            auVar153._8_4_ = 0x40000000;
            auVar153._0_8_ = 0x4000000040000000;
            auVar153._12_4_ = 0x40000000;
            auVar153._16_4_ = 0x40000000;
            auVar153._20_4_ = 0x40000000;
            auVar153._24_4_ = 0x40000000;
            auVar153._28_4_ = 0x40000000;
            auVar106 = vfmadd213ps_fma(local_540,auVar153,auVar133);
            local_440 = _local_2c0;
            local_420 = ZEXT1632(auVar106);
            local_400 = local_620;
            local_3e0 = 0;
            local_540 = local_420;
            if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6c0 = vandps_avx(auVar119,auVar171);
              fVar141 = 1.0 / auVar113._0_4_;
              local_360[0] = fVar141 * ((float)local_2c0._0_4_ + 0.0);
              local_360[1] = fVar141 * ((float)local_2c0._4_4_ + 1.0);
              local_360[2] = fVar141 * (fStack_2b8 + 2.0);
              local_360[3] = fVar141 * (fStack_2b4 + 3.0);
              fStack_350 = fVar141 * (fStack_2b0 + 4.0);
              fStack_34c = fVar141 * (fStack_2ac + 5.0);
              fStack_348 = fVar141 * (fStack_2a8 + 6.0);
              fStack_344 = fStack_2a4 + 7.0;
              local_540._0_8_ = auVar106._0_8_;
              local_540._8_8_ = auVar106._8_8_;
              local_340 = local_540._0_8_;
              uStack_338 = local_540._8_8_;
              uStack_330 = 0;
              uStack_328 = 0;
              local_320 = local_620;
              auVar134._8_4_ = 0x7f800000;
              auVar134._0_8_ = 0x7f8000007f800000;
              auVar134._12_4_ = 0x7f800000;
              auVar134._16_4_ = 0x7f800000;
              auVar134._20_4_ = 0x7f800000;
              auVar134._24_4_ = 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar119 = vblendvps_avx(auVar134,local_620,local_6c0);
              auVar121 = vshufps_avx(auVar119,auVar119,0xb1);
              auVar121 = vminps_avx(auVar119,auVar121);
              auVar178 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar178);
              auVar178 = vpermpd_avx2(auVar121,0x4e);
              auVar121 = vminps_avx(auVar121,auVar178);
              auVar121 = vcmpps_avx(auVar119,auVar121,0);
              auVar178 = local_6c0 & auVar121;
              auVar119 = local_6c0;
              if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar178 >> 0x7f,0) != '\0') ||
                    (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar178 >> 0xbf,0) != '\0') ||
                  (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar178[0x1f] < '\0') {
                auVar119 = vandps_avx(auVar121,local_6c0);
              }
              uVar99 = vmovmskps_avx(auVar119);
              uVar7 = 0;
              for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                uVar7 = uVar7 + 1;
              }
              uVar100 = (ulong)uVar7;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar141 = local_360[uVar100];
                fVar179 = 1.0 - fVar141;
                auVar107 = ZEXT416((uint)fVar141);
                auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar107,
                                          ZEXT416(0xc0a00000));
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * 3.0)),
                                          ZEXT416((uint)(fVar141 + fVar141)),auVar19);
                auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar107,
                                          ZEXT416(0x40000000));
                auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179 * -3.0)),
                                          ZEXT416((uint)(fVar179 + fVar179)),auVar19);
                auVar106 = vfnmadd231ss_fma(ZEXT416((uint)(fVar141 * (fVar179 + fVar179))),
                                            ZEXT416((uint)fVar179),ZEXT416((uint)fVar179));
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),auVar107,
                                           ZEXT416((uint)(fVar179 * -2.0)));
                fVar179 = auVar19._0_4_ * 0.5;
                fVar180 = auVar107._0_4_ * 0.5;
                auVar158._0_4_ = fVar180 * local_8e0;
                auVar158._4_4_ = fVar180 * fStack_8dc;
                auVar158._8_4_ = fVar180 * fStack_8d8;
                auVar158._12_4_ = fVar180 * fStack_8d4;
                auVar125._4_4_ = fVar179;
                auVar125._0_4_ = fVar179;
                auVar125._8_4_ = fVar179;
                auVar125._12_4_ = fVar179;
                auVar19 = vfmadd132ps_fma(auVar125,auVar158,*pauVar3);
                fVar179 = auVar20._0_4_ * 0.5;
                auVar159._4_4_ = fVar179;
                auVar159._0_4_ = fVar179;
                auVar159._8_4_ = fVar179;
                auVar159._12_4_ = fVar179;
                auVar19 = vfmadd132ps_fma(auVar159,auVar19,*pauVar2);
                uVar104 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                fVar179 = auVar106._0_4_ * 0.5;
                auVar143._4_4_ = fVar179;
                auVar143._0_4_ = fVar179;
                auVar143._8_4_ = fVar179;
                auVar143._12_4_ = fVar179;
                auVar19 = vfmadd132ps_fma(auVar143,auVar19,*pauVar1);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar100 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar19._0_4_;
                uVar210 = vextractps_avx(auVar19,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar210;
                uVar210 = vextractps_avx(auVar19,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar210;
                *(float *)(ray + k * 4 + 0x1e0) = fVar141;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar104;
                *(uint *)(ray + k * 4 + 0x220) = uVar97;
                *(undefined4 *)(ray + k * 4 + 0x240) = local_860._4_4_;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_860._0_4_ = local_860._4_4_;
                local_860._8_4_ = local_860._4_4_;
                local_860._12_4_ = local_860._4_4_;
                local_860._16_4_ = local_860._4_4_;
                local_860._20_4_ = local_860._4_4_;
                local_860._24_4_ = local_860._4_4_;
                local_860._28_4_ = local_860._4_4_;
                local_700._4_4_ = uVar97;
                local_700._0_4_ = uVar97;
                local_700._8_4_ = uVar97;
                local_700._12_4_ = uVar97;
                local_700._16_4_ = uVar97;
                local_700._20_4_ = uVar97;
                local_700._24_4_ = uVar97;
                local_700._28_4_ = uVar97;
                uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_7d0 = ray;
                local_780 = auVar162;
                local_720 = auVar212;
                local_3dc = iVar98;
                local_3d0 = uVar192;
                uStack_3c8 = uVar88;
                local_3c0 = uVar89;
                uStack_3b8 = uVar90;
                local_3b0 = uVar91;
                uStack_3a8 = uVar92;
                local_3a0 = uVar93;
                uStack_398 = uVar94;
                while( true ) {
                  fVar141 = local_360[uVar100];
                  auVar109._4_4_ = fVar141;
                  auVar109._0_4_ = fVar141;
                  auVar109._8_4_ = fVar141;
                  auVar109._12_4_ = fVar141;
                  local_240._16_4_ = fVar141;
                  local_240._0_16_ = auVar109;
                  local_240._20_4_ = fVar141;
                  local_240._24_4_ = fVar141;
                  local_240._28_4_ = fVar141;
                  local_220 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar100 * 4);
                  fVar179 = 1.0 - fVar141;
                  auVar106 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                             ZEXT416(0xc0a00000));
                  auVar193 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * 3.0)),
                                             ZEXT416((uint)(fVar141 + fVar141)),auVar106);
                  auVar106 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                             ZEXT416(0x40000000));
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179 * -3.0)),
                                             ZEXT416((uint)(fVar179 + fVar179)),auVar106);
                  auVar149 = vfnmadd231ss_fma(ZEXT416((uint)(fVar141 * (fVar179 + fVar179))),
                                              ZEXT416((uint)fVar179),ZEXT416((uint)fVar179));
                  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),auVar109,
                                            ZEXT416((uint)(fVar179 * -2.0)));
                  fVar141 = auVar106._0_4_ * 0.5;
                  fVar179 = auVar21._0_4_ * 0.5;
                  auVar168._0_4_ = fVar179 * local_8e0;
                  auVar168._4_4_ = fVar179 * fStack_8dc;
                  auVar168._8_4_ = fVar179 * fStack_8d8;
                  auVar168._12_4_ = fVar179 * fStack_8d4;
                  auVar148._4_4_ = fVar141;
                  auVar148._0_4_ = fVar141;
                  auVar148._8_4_ = fVar141;
                  auVar148._12_4_ = fVar141;
                  auVar106 = vfmadd132ps_fma(auVar148,auVar168,auVar19);
                  fVar141 = auVar193._0_4_ * 0.5;
                  auVar169._4_4_ = fVar141;
                  auVar169._0_4_ = fVar141;
                  auVar169._8_4_ = fVar141;
                  auVar169._12_4_ = fVar141;
                  auVar106 = vfmadd132ps_fma(auVar169,auVar106,auVar20);
                  local_808.context = context->user;
                  fVar141 = auVar149._0_4_ * 0.5;
                  auVar149._4_4_ = fVar141;
                  auVar149._0_4_ = fVar141;
                  auVar149._8_4_ = fVar141;
                  auVar149._12_4_ = fVar141;
                  auVar193 = vfmadd132ps_fma(auVar149,auVar106,auVar107);
                  local_2a0 = auVar193._0_4_;
                  uStack_29c = local_2a0;
                  uStack_298 = local_2a0;
                  uStack_294 = local_2a0;
                  uStack_290 = local_2a0;
                  uStack_28c = local_2a0;
                  uStack_288 = local_2a0;
                  uStack_284 = local_2a0;
                  auVar106 = vmovshdup_avx(auVar193);
                  local_280 = auVar106._0_8_;
                  uStack_278 = local_280;
                  uStack_270 = local_280;
                  uStack_268 = local_280;
                  auVar106 = vshufps_avx(auVar193,auVar193,0xaa);
                  auVar150._0_8_ = auVar106._0_8_;
                  auVar150._8_8_ = auVar150._0_8_;
                  auVar157._16_8_ = auVar150._0_8_;
                  auVar157._0_16_ = auVar150;
                  auVar157._24_8_ = auVar150._0_8_;
                  local_260 = auVar157;
                  uStack_21c = local_220;
                  uStack_218 = local_220;
                  uStack_214 = local_220;
                  uStack_210 = local_220;
                  uStack_20c = local_220;
                  uStack_208 = local_220;
                  uStack_204 = local_220;
                  local_200 = local_700._0_8_;
                  uStack_1f8 = local_700._8_8_;
                  uStack_1f0 = local_700._16_8_;
                  uStack_1e8 = local_700._24_8_;
                  local_1e0 = local_860;
                  auVar119 = vpcmpeqd_avx2(local_860,local_860);
                  local_7c8[1] = auVar119;
                  *local_7c8 = auVar119;
                  local_1c0 = (local_808.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_808.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_6a0[0] = local_300;
                  local_808.valid = (int *)local_6a0;
                  local_808.geometryUserPtr = pGVar17->userPtr;
                  local_808.hit = (RTCHitN *)&local_2a0;
                  local_808.N = 8;
                  local_808.ray = (RTCRayN *)ray;
                  if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar157 = ZEXT1632(auVar150);
                    (*pGVar17->intersectionFilterN)(&local_808);
                    auVar217 = ZEXT3264(_local_760);
                    auVar213 = ZEXT3264(local_720);
                    auVar209 = ZEXT3264(local_780);
                    auVar200 = ZEXT3264(CONCAT428(fStack_784,
                                                  CONCAT424(fStack_788,
                                                            CONCAT420(fStack_78c,
                                                                      CONCAT416(fStack_790,
                                                                                CONCAT412(fStack_794
                                                                                          ,CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
                    ray = local_7d0;
                  }
                  auVar121 = vpcmpeqd_avx2(local_6a0[0],_DAT_01faff00);
                  auVar178 = vpcmpeqd_avx2(auVar157,auVar157);
                  auVar119 = auVar178 & ~auVar121;
                  if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar119 >> 0x7f,0) == '\0') &&
                        (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar119 >> 0xbf,0) == '\0') &&
                      (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar119[0x1f]) {
                    auVar121 = auVar121 ^ auVar178;
                  }
                  else {
                    p_Var18 = context->args->filter;
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar178 = ZEXT1632(auVar178._0_16_);
                      (*p_Var18)(&local_808);
                      auVar217 = ZEXT3264(_local_760);
                      auVar213 = ZEXT3264(local_720);
                      auVar209 = ZEXT3264(local_780);
                      auVar200 = ZEXT3264(CONCAT428(fStack_784,
                                                    CONCAT424(fStack_788,
                                                              CONCAT420(fStack_78c,
                                                                        CONCAT416(fStack_790,
                                                                                  CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                      ray = local_7d0;
                    }
                    auVar117 = vpcmpeqd_avx2(local_6a0[0],SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                                            );
                    auVar178 = vpcmpeqd_avx2(auVar178,auVar178);
                    auVar121 = auVar117 ^ auVar178;
                    auVar119 = auVar178 & ~auVar117;
                    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar119 >> 0x7f,0) != '\0') ||
                          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar119 >> 0xbf,0) != '\0') ||
                        (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar119[0x1f] < '\0') {
                      auVar139._0_4_ = auVar117._0_4_ ^ auVar178._0_4_;
                      auVar139._4_4_ = auVar117._4_4_ ^ auVar178._4_4_;
                      auVar139._8_4_ = auVar117._8_4_ ^ auVar178._8_4_;
                      auVar139._12_4_ = auVar117._12_4_ ^ auVar178._12_4_;
                      auVar139._16_4_ = auVar117._16_4_ ^ auVar178._16_4_;
                      auVar139._20_4_ = auVar117._20_4_ ^ auVar178._20_4_;
                      auVar139._24_4_ = auVar117._24_4_ ^ auVar178._24_4_;
                      auVar139._28_4_ = auVar117._28_4_ ^ auVar178._28_4_;
                      auVar119 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])local_808.hit);
                      *(undefined1 (*) [32])(local_808.ray + 0x180) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_808.hit + 0x20));
                      *(undefined1 (*) [32])(local_808.ray + 0x1a0) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_808.hit + 0x40));
                      *(undefined1 (*) [32])(local_808.ray + 0x1c0) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_808.hit + 0x60));
                      *(undefined1 (*) [32])(local_808.ray + 0x1e0) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_808.hit + 0x80));
                      *(undefined1 (*) [32])(local_808.ray + 0x200) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_808.hit + 0xa0));
                      *(undefined1 (*) [32])(local_808.ray + 0x220) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_808.hit + 0xc0));
                      *(undefined1 (*) [32])(local_808.ray + 0x240) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_808.hit + 0xe0));
                      *(undefined1 (*) [32])(local_808.ray + 0x260) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_808.hit + 0x100));
                      *(undefined1 (*) [32])(local_808.ray + 0x280) = auVar119;
                    }
                  }
                  auVar119 = local_620;
                  auVar212 = auVar213._0_32_;
                  auVar162 = auVar209._0_32_;
                  if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar121 >> 0x7f,0) == '\0') &&
                        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar121 >> 0xbf,0) == '\0') &&
                      (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar121[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar104;
                  }
                  else {
                    uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_6c0 + uVar100 * 4) = 0;
                  auVar123._4_4_ = uVar104;
                  auVar123._0_4_ = uVar104;
                  auVar123._8_4_ = uVar104;
                  auVar123._12_4_ = uVar104;
                  auVar123._16_4_ = uVar104;
                  auVar123._20_4_ = uVar104;
                  auVar123._24_4_ = uVar104;
                  auVar123._28_4_ = uVar104;
                  auVar178 = vcmpps_avx(auVar119,auVar123,2);
                  auVar121 = vandps_avx(auVar178,local_6c0);
                  local_6c0 = local_6c0 & auVar178;
                  if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                        (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                      (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6c0[0x1f]) break;
                  auVar140._8_4_ = 0x7f800000;
                  auVar140._0_8_ = 0x7f8000007f800000;
                  auVar140._12_4_ = 0x7f800000;
                  auVar140._16_4_ = 0x7f800000;
                  auVar140._20_4_ = 0x7f800000;
                  auVar140._24_4_ = 0x7f800000;
                  auVar140._28_4_ = 0x7f800000;
                  auVar119 = vblendvps_avx(auVar140,auVar119,auVar121);
                  auVar178 = vshufps_avx(auVar119,auVar119,0xb1);
                  auVar178 = vminps_avx(auVar119,auVar178);
                  auVar117 = vshufpd_avx(auVar178,auVar178,5);
                  auVar178 = vminps_avx(auVar178,auVar117);
                  auVar117 = vpermpd_avx2(auVar178,0x4e);
                  auVar178 = vminps_avx(auVar178,auVar117);
                  auVar178 = vcmpps_avx(auVar119,auVar178,0);
                  auVar117 = auVar121 & auVar178;
                  auVar119 = auVar121;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0x7f,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar117 >> 0xbf,0) != '\0') ||
                      (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar117[0x1f] < '\0') {
                    auVar119 = vandps_avx(auVar178,auVar121);
                  }
                  uVar99 = vmovmskps_avx(auVar119);
                  uVar7 = 0;
                  for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                    uVar7 = uVar7 + 1;
                  }
                  uVar100 = (ulong)uVar7;
                  local_6c0 = auVar121;
                }
              }
            }
            goto LAB_017f4683;
          }
        }
        auVar200 = ZEXT3264(auVar202);
      }
LAB_017f4683:
      if (8 < iVar98) {
        _local_760 = auVar217._0_32_;
        local_500._4_4_ = fVar142;
        local_500._0_4_ = fVar142;
        fStack_4f8 = fVar142;
        fStack_4f4 = fVar142;
        fStack_4f0 = fVar142;
        fStack_4ec = fVar142;
        fStack_4e8 = fVar142;
        fStack_4e4 = fVar142;
        local_520._4_4_ = local_740._0_4_;
        local_520._0_4_ = local_740._0_4_;
        local_520._8_4_ = local_740._0_4_;
        local_520._12_4_ = local_740._0_4_;
        local_520._16_4_ = local_740._0_4_;
        local_520._20_4_ = local_740._0_4_;
        local_520._24_4_ = local_740._0_4_;
        local_520._28_4_ = local_740._0_4_;
        local_180 = 1.0 / (float)local_5e0._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        local_140 = local_860._4_4_;
        uStack_13c = local_860._4_4_;
        uStack_138 = local_860._4_4_;
        uStack_134 = local_860._4_4_;
        uStack_130 = local_860._4_4_;
        uStack_12c = local_860._4_4_;
        uStack_128 = local_860._4_4_;
        uStack_124 = local_860._4_4_;
        local_160 = uVar97;
        uStack_15c = uVar97;
        uStack_158 = uVar97;
        uStack_154 = uVar97;
        uStack_150 = uVar97;
        uStack_14c = uVar97;
        uStack_148 = uVar97;
        uStack_144 = uVar97;
        lVar103 = 8;
        local_780 = auVar162;
        local_720 = auVar212;
        local_4e0 = (float)iVar98;
        fStack_4dc = (float)iVar98;
        fStack_4d8 = (float)iVar98;
        fStack_4d4 = (float)iVar98;
        fStack_4d0 = (float)iVar98;
        fStack_4cc = (float)iVar98;
        fStack_4c8 = (float)iVar98;
        iStack_4c4 = iVar98;
        do {
          auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar103 * 4 + lVar24);
          auVar121 = *(undefined1 (*) [32])(lVar24 + 0x21b37f0 + lVar103 * 4);
          local_740 = *(undefined1 (*) [32])(lVar24 + 0x21b3c74 + lVar103 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar24 + 0x21b40f8 + lVar103 * 4);
          auVar96 = *(undefined1 (*) [28])*pauVar5;
          auVar213._0_4_ = local_580 * *(float *)*pauVar5;
          auVar213._4_4_ = fStack_57c * *(float *)(*pauVar5 + 4);
          auVar213._8_4_ = fStack_578 * *(float *)(*pauVar5 + 8);
          auVar213._12_4_ = fStack_574 * *(float *)(*pauVar5 + 0xc);
          auVar213._16_4_ = fStack_570 * *(float *)(*pauVar5 + 0x10);
          auVar213._20_4_ = fStack_56c * *(float *)(*pauVar5 + 0x14);
          auVar213._28_36_ = auVar217._28_36_;
          auVar213._24_4_ = fStack_568 * *(float *)(*pauVar5 + 0x18);
          auVar53._4_4_ = auVar200._4_4_ * *(float *)(*pauVar5 + 4);
          auVar53._0_4_ = auVar200._0_4_ * *(float *)*pauVar5;
          auVar53._8_4_ = auVar200._8_4_ * *(float *)(*pauVar5 + 8);
          auVar53._12_4_ = auVar200._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar53._16_4_ = auVar200._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar53._20_4_ = auVar200._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar53._24_4_ = auVar200._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar53._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
          auVar19 = vfmadd231ps_fma(auVar213._0_32_,local_740,local_7c0);
          auVar20 = vfmadd231ps_fma(auVar53,local_740,local_6e0);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar121,auVar232);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar121,local_5c0);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar119,auVar227);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar119,local_5a0);
          auVar178 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar103 * 4 + lVar24);
          auVar117 = *(undefined1 (*) [32])(lVar24 + 0x21b5c10 + lVar103 * 4);
          auVar132 = *(undefined1 (*) [32])(lVar24 + 0x21b6094 + lVar103 * 4);
          pfVar6 = (float *)(lVar24 + 0x21b6518 + lVar103 * 4);
          fVar184 = *pfVar6;
          fVar87 = pfVar6[1];
          fVar214 = pfVar6[2];
          fVar218 = pfVar6[3];
          fVar220 = pfVar6[4];
          fVar221 = pfVar6[5];
          fVar222 = pfVar6[6];
          auVar54._4_4_ = fStack_57c * fVar87;
          auVar54._0_4_ = local_580 * fVar184;
          auVar54._8_4_ = fStack_578 * fVar214;
          auVar54._12_4_ = fStack_574 * fVar218;
          auVar54._16_4_ = fStack_570 * fVar220;
          auVar54._20_4_ = fStack_56c * fVar221;
          auVar54._24_4_ = fStack_568 * fVar222;
          auVar54._28_4_ = local_740._28_4_;
          auVar55._4_4_ = auVar200._4_4_ * fVar87;
          auVar55._0_4_ = auVar200._0_4_ * fVar184;
          auVar55._8_4_ = auVar200._8_4_ * fVar214;
          auVar55._12_4_ = auVar200._12_4_ * fVar218;
          auVar55._16_4_ = auVar200._16_4_ * fVar220;
          auVar55._20_4_ = auVar200._20_4_ * fVar221;
          auVar55._24_4_ = auVar200._24_4_ * fVar222;
          auVar55._28_4_ = fStack_564;
          auVar107 = vfmadd231ps_fma(auVar54,auVar132,local_7c0);
          auVar106 = vfmadd231ps_fma(auVar55,auVar132,local_6e0);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar117,auVar232);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar117,local_5c0);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar178,auVar227);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar178,local_5a0);
          local_600 = ZEXT1632(auVar107);
          local_4c0 = ZEXT1632(auVar19);
          auVar174 = vsubps_avx(local_600,local_4c0);
          local_700 = ZEXT1632(auVar106);
          local_480 = ZEXT1632(auVar20);
          local_4a0 = vsubps_avx(local_700,local_480);
          auVar86._4_4_ = auVar174._4_4_ * auVar20._4_4_;
          auVar86._0_4_ = auVar174._0_4_ * auVar20._0_4_;
          auVar86._8_4_ = auVar174._8_4_ * auVar20._8_4_;
          auVar86._12_4_ = auVar174._12_4_ * auVar20._12_4_;
          auVar86._16_4_ = auVar174._16_4_ * 0.0;
          auVar86._20_4_ = auVar174._20_4_ * 0.0;
          auVar86._24_4_ = auVar174._24_4_ * 0.0;
          auVar86._28_4_ = local_5c0._28_4_;
          fVar142 = local_4a0._0_4_;
          fVar141 = local_4a0._4_4_;
          auVar85._4_4_ = auVar19._4_4_ * fVar141;
          auVar85._0_4_ = auVar19._0_4_ * fVar142;
          fVar179 = local_4a0._8_4_;
          auVar85._8_4_ = auVar19._8_4_ * fVar179;
          fVar180 = local_4a0._12_4_;
          auVar85._12_4_ = auVar19._12_4_ * fVar180;
          fVar181 = local_4a0._16_4_;
          auVar85._16_4_ = fVar181 * 0.0;
          fVar182 = local_4a0._20_4_;
          auVar85._20_4_ = fVar182 * 0.0;
          fVar183 = local_4a0._24_4_;
          auVar85._24_4_ = fVar183 * 0.0;
          auVar85._28_4_ = local_7c0._28_4_;
          auVar217 = ZEXT3264(*pauVar5);
          auVar154 = vsubps_avx(auVar86,auVar85);
          auVar56._4_4_ = auVar96._4_4_ * local_100._4_4_;
          auVar56._0_4_ = auVar96._0_4_ * (float)local_100;
          auVar56._8_4_ = auVar96._8_4_ * (float)uStack_f8;
          auVar56._12_4_ = auVar96._12_4_ * uStack_f8._4_4_;
          auVar56._16_4_ = auVar96._16_4_ * (float)uStack_f0;
          auVar56._20_4_ = auVar96._20_4_ * uStack_f0._4_4_;
          auVar56._24_4_ = auVar96._24_4_ * (float)uStack_e8;
          auVar56._28_4_ = local_5c0._28_4_;
          auVar19 = vfmadd231ps_fma(auVar56,local_740,local_e0);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar121,local_c0);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_a0,auVar119);
          auVar57._4_4_ = local_100._4_4_ * fVar87;
          auVar57._0_4_ = (float)local_100 * fVar184;
          auVar57._8_4_ = (float)uStack_f8 * fVar214;
          auVar57._12_4_ = uStack_f8._4_4_ * fVar218;
          auVar57._16_4_ = (float)uStack_f0 * fVar220;
          auVar57._20_4_ = uStack_f0._4_4_ * fVar221;
          auVar57._24_4_ = (float)uStack_e8 * fVar222;
          auVar57._28_4_ = uStack_e8._4_4_;
          auVar20 = vfmadd231ps_fma(auVar57,auVar132,local_e0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar117,local_c0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar178,local_a0);
          auVar58._4_4_ = fVar141 * fVar141;
          auVar58._0_4_ = fVar142 * fVar142;
          auVar58._8_4_ = fVar179 * fVar179;
          auVar58._12_4_ = fVar180 * fVar180;
          auVar58._16_4_ = fVar181 * fVar181;
          auVar58._20_4_ = fVar182 * fVar182;
          auVar58._24_4_ = fVar183 * fVar183;
          auVar58._28_4_ = local_4a0._28_4_;
          auVar107 = vfmadd231ps_fma(auVar58,auVar174,auVar174);
          auVar205 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar20));
          auVar203._0_4_ = auVar205._0_4_ * auVar205._0_4_ * auVar107._0_4_;
          auVar203._4_4_ = auVar205._4_4_ * auVar205._4_4_ * auVar107._4_4_;
          auVar203._8_4_ = auVar205._8_4_ * auVar205._8_4_ * auVar107._8_4_;
          auVar203._12_4_ = auVar205._12_4_ * auVar205._12_4_ * auVar107._12_4_;
          auVar203._16_4_ = auVar205._16_4_ * auVar205._16_4_ * 0.0;
          auVar203._20_4_ = auVar205._20_4_ * auVar205._20_4_ * 0.0;
          auVar203._24_4_ = auVar205._24_4_ * auVar205._24_4_ * 0.0;
          auVar203._28_4_ = 0;
          auVar59._4_4_ = auVar154._4_4_ * auVar154._4_4_;
          auVar59._0_4_ = auVar154._0_4_ * auVar154._0_4_;
          auVar59._8_4_ = auVar154._8_4_ * auVar154._8_4_;
          auVar59._12_4_ = auVar154._12_4_ * auVar154._12_4_;
          auVar59._16_4_ = auVar154._16_4_ * auVar154._16_4_;
          auVar59._20_4_ = auVar154._20_4_ * auVar154._20_4_;
          auVar59._24_4_ = auVar154._24_4_ * auVar154._24_4_;
          auVar59._28_4_ = auVar154._28_4_;
          auVar205 = vcmpps_avx(auVar59,auVar203,2);
          local_3e0 = (int)lVar103;
          auVar204._4_4_ = local_3e0;
          auVar204._0_4_ = local_3e0;
          auVar204._8_4_ = local_3e0;
          auVar204._12_4_ = local_3e0;
          auVar204._16_4_ = local_3e0;
          auVar204._20_4_ = local_3e0;
          auVar204._24_4_ = local_3e0;
          auVar204._28_4_ = local_3e0;
          auVar154 = vpor_avx2(auVar204,_DAT_01fe9900);
          auVar95._4_4_ = fStack_4dc;
          auVar95._0_4_ = local_4e0;
          auVar95._8_4_ = fStack_4d8;
          auVar95._12_4_ = fStack_4d4;
          auVar95._16_4_ = fStack_4d0;
          auVar95._20_4_ = fStack_4cc;
          auVar95._24_4_ = fStack_4c8;
          auVar95._28_4_ = iStack_4c4;
          auVar23 = vpcmpgtd_avx2(auVar95,auVar154);
          auVar154 = auVar23 & auVar205;
          if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar154 >> 0x7f,0) == '\0') &&
                (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar154 >> 0xbf,0) == '\0') &&
              (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar154[0x1f]) {
            auVar200 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
          }
          else {
            local_5e0 = vandps_avx(auVar23,auVar205);
            auVar60._4_4_ = (float)local_760._4_4_ * fVar87;
            auVar60._0_4_ = (float)local_760._0_4_ * fVar184;
            auVar60._8_4_ = fStack_758 * fVar214;
            auVar60._12_4_ = fStack_754 * fVar218;
            auVar60._16_4_ = fStack_750 * fVar220;
            auVar60._20_4_ = fStack_74c * fVar221;
            auVar60._24_4_ = fStack_748 * fVar222;
            auVar60._28_4_ = auVar205._28_4_;
            auVar107 = vfmadd213ps_fma(auVar132,local_720,auVar60);
            auVar107 = vfmadd213ps_fma(auVar117,local_780,ZEXT1632(auVar107));
            auVar107 = vfmadd213ps_fma(auVar178,local_660,ZEXT1632(auVar107));
            auVar61._4_4_ = (float)local_760._4_4_ * auVar96._4_4_;
            auVar61._0_4_ = (float)local_760._0_4_ * auVar96._0_4_;
            auVar61._8_4_ = fStack_758 * auVar96._8_4_;
            auVar61._12_4_ = fStack_754 * auVar96._12_4_;
            auVar61._16_4_ = fStack_750 * auVar96._16_4_;
            auVar61._20_4_ = fStack_74c * auVar96._20_4_;
            auVar61._24_4_ = fStack_748 * auVar96._24_4_;
            auVar61._28_4_ = auVar205._28_4_;
            auVar106 = vfmadd213ps_fma(local_740,local_720,auVar61);
            auVar106 = vfmadd213ps_fma(auVar121,local_780,ZEXT1632(auVar106));
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x21b457c + lVar103 * 4);
            auVar178 = *(undefined1 (*) [32])(lVar24 + 0x21b4a00 + lVar103 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar24 + 0x21b4e84 + lVar103 * 4);
            pfVar6 = (float *)(lVar24 + 0x21b5308 + lVar103 * 4);
            fVar142 = *pfVar6;
            fVar141 = pfVar6[1];
            fVar179 = pfVar6[2];
            fVar180 = pfVar6[3];
            fVar181 = pfVar6[4];
            fVar182 = pfVar6[5];
            fVar183 = pfVar6[6];
            auVar198._0_4_ = local_580 * fVar142;
            auVar198._4_4_ = fStack_57c * fVar141;
            auVar198._8_4_ = fStack_578 * fVar179;
            auVar198._12_4_ = fStack_574 * fVar180;
            auVar198._16_4_ = fStack_570 * fVar181;
            auVar198._20_4_ = fStack_56c * fVar182;
            auVar198._24_4_ = fStack_568 * fVar183;
            auVar198._28_4_ = 0;
            auVar62._4_4_ = fStack_79c * fVar141;
            auVar62._0_4_ = local_7a0 * fVar142;
            auVar62._8_4_ = fStack_798 * fVar179;
            auVar62._12_4_ = fStack_794 * fVar180;
            auVar62._16_4_ = fStack_790 * fVar181;
            auVar62._20_4_ = fStack_78c * fVar182;
            auVar62._24_4_ = fStack_788 * fVar183;
            auVar62._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
            auVar63._4_4_ = fVar141 * (float)local_760._4_4_;
            auVar63._0_4_ = fVar142 * (float)local_760._0_4_;
            auVar63._8_4_ = fVar179 * fStack_758;
            auVar63._12_4_ = fVar180 * fStack_754;
            auVar63._16_4_ = fVar181 * fStack_750;
            auVar63._20_4_ = fVar182 * fStack_74c;
            auVar63._24_4_ = fVar183 * fStack_748;
            auVar63._28_4_ = pfVar6[7];
            auVar193 = vfmadd231ps_fma(auVar198,auVar117,local_7c0);
            auVar21 = vfmadd231ps_fma(auVar62,auVar117,local_6e0);
            auVar149 = vfmadd231ps_fma(auVar63,local_720,auVar117);
            auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar178,auVar232);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar178,local_5c0);
            auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),local_780,auVar178);
            auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar121,auVar227);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar121,local_5a0);
            auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),local_660,auVar121);
            pfVar6 = (float *)(lVar24 + 0x21b7728 + lVar103 * 4);
            fVar142 = *pfVar6;
            fVar141 = pfVar6[1];
            fVar179 = pfVar6[2];
            fVar180 = pfVar6[3];
            fVar181 = pfVar6[4];
            fVar182 = pfVar6[5];
            fVar183 = pfVar6[6];
            auVar64._4_4_ = fStack_57c * fVar141;
            auVar64._0_4_ = local_580 * fVar142;
            auVar64._8_4_ = fStack_578 * fVar179;
            auVar64._12_4_ = fStack_574 * fVar180;
            auVar64._16_4_ = fStack_570 * fVar181;
            auVar64._20_4_ = fStack_56c * fVar182;
            auVar64._24_4_ = fStack_568 * fVar183;
            auVar64._28_4_ = fStack_564;
            auVar65._4_4_ = fStack_79c * fVar141;
            auVar65._0_4_ = local_7a0 * fVar142;
            auVar65._8_4_ = fStack_798 * fVar179;
            auVar65._12_4_ = fStack_794 * fVar180;
            auVar65._16_4_ = fStack_790 * fVar181;
            auVar65._20_4_ = fStack_78c * fVar182;
            auVar65._24_4_ = fStack_788 * fVar183;
            auVar65._28_4_ = local_660._28_4_;
            auVar66._4_4_ = fVar141 * (float)local_760._4_4_;
            auVar66._0_4_ = fVar142 * (float)local_760._0_4_;
            auVar66._8_4_ = fVar179 * fStack_758;
            auVar66._12_4_ = fVar180 * fStack_754;
            auVar66._16_4_ = fVar181 * fStack_750;
            auVar66._20_4_ = fVar182 * fStack_74c;
            auVar66._24_4_ = fVar183 * fStack_748;
            auVar66._28_4_ = pfVar6[7];
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x21b72a4 + lVar103 * 4);
            auVar165 = vfmadd231ps_fma(auVar64,auVar121,local_7c0);
            auVar185 = vfmadd231ps_fma(auVar65,auVar121,local_6e0);
            auVar186 = vfmadd231ps_fma(auVar66,auVar121,local_720);
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x21b6e20 + lVar103 * 4);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar121,auVar232);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar121,local_5c0);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar121,local_780);
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x21b699c + lVar103 * 4);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar121,auVar227);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar121,local_5a0);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),local_660,auVar121);
            auVar121 = vandps_avx(ZEXT1632(auVar193),local_2e0);
            auVar178 = vandps_avx(ZEXT1632(auVar21),local_2e0);
            auVar178 = vmaxps_avx(auVar121,auVar178);
            auVar121 = vandps_avx(ZEXT1632(auVar149),local_2e0);
            auVar121 = vmaxps_avx(auVar178,auVar121);
            auVar121 = vcmpps_avx(auVar121,_local_500,1);
            auVar117 = vblendvps_avx(ZEXT1632(auVar193),auVar174,auVar121);
            auVar132 = vblendvps_avx(ZEXT1632(auVar21),local_4a0,auVar121);
            auVar121 = vandps_avx(ZEXT1632(auVar165),local_2e0);
            auVar178 = vandps_avx(ZEXT1632(auVar185),local_2e0);
            auVar178 = vmaxps_avx(auVar121,auVar178);
            auVar121 = vandps_avx(local_2e0,ZEXT1632(auVar186));
            auVar121 = vmaxps_avx(auVar178,auVar121);
            auVar178 = vcmpps_avx(auVar121,_local_500,1);
            auVar121 = vblendvps_avx(ZEXT1632(auVar165),auVar174,auVar178);
            auVar178 = vblendvps_avx(ZEXT1632(auVar185),local_4a0,auVar178);
            auVar106 = vfmadd213ps_fma(auVar119,local_660,ZEXT1632(auVar106));
            auVar193 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
            auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar132,auVar132);
            auVar119 = vrsqrtps_avx(ZEXT1632(auVar193));
            fVar142 = auVar119._0_4_;
            fVar141 = auVar119._4_4_;
            fVar179 = auVar119._8_4_;
            fVar180 = auVar119._12_4_;
            fVar181 = auVar119._16_4_;
            fVar182 = auVar119._20_4_;
            fVar183 = auVar119._24_4_;
            auVar67._4_4_ = fVar141 * fVar141 * fVar141 * auVar193._4_4_ * -0.5;
            auVar67._0_4_ = fVar142 * fVar142 * fVar142 * auVar193._0_4_ * -0.5;
            auVar67._8_4_ = fVar179 * fVar179 * fVar179 * auVar193._8_4_ * -0.5;
            auVar67._12_4_ = fVar180 * fVar180 * fVar180 * auVar193._12_4_ * -0.5;
            auVar67._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar67._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar67._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar67._28_4_ = 0;
            auVar229._8_4_ = 0x3fc00000;
            auVar229._0_8_ = 0x3fc000003fc00000;
            auVar229._12_4_ = 0x3fc00000;
            auVar229._16_4_ = 0x3fc00000;
            auVar229._20_4_ = 0x3fc00000;
            auVar229._24_4_ = 0x3fc00000;
            auVar229._28_4_ = 0x3fc00000;
            auVar193 = vfmadd231ps_fma(auVar67,auVar229,auVar119);
            fVar142 = auVar193._0_4_;
            fVar141 = auVar193._4_4_;
            auVar68._4_4_ = auVar132._4_4_ * fVar141;
            auVar68._0_4_ = auVar132._0_4_ * fVar142;
            fVar179 = auVar193._8_4_;
            auVar68._8_4_ = auVar132._8_4_ * fVar179;
            fVar180 = auVar193._12_4_;
            auVar68._12_4_ = auVar132._12_4_ * fVar180;
            auVar68._16_4_ = auVar132._16_4_ * 0.0;
            auVar68._20_4_ = auVar132._20_4_ * 0.0;
            auVar68._24_4_ = auVar132._24_4_ * 0.0;
            auVar68._28_4_ = auVar132._28_4_;
            auVar69._4_4_ = fVar141 * -auVar117._4_4_;
            auVar69._0_4_ = fVar142 * -auVar117._0_4_;
            auVar69._8_4_ = fVar179 * -auVar117._8_4_;
            auVar69._12_4_ = fVar180 * -auVar117._12_4_;
            auVar69._16_4_ = -auVar117._16_4_ * 0.0;
            auVar69._20_4_ = -auVar117._20_4_ * 0.0;
            auVar69._24_4_ = -auVar117._24_4_ * 0.0;
            auVar69._28_4_ = auVar119._28_4_;
            auVar193 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
            auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar178,auVar178);
            auVar119 = vrsqrtps_avx(ZEXT1632(auVar193));
            auVar70._28_4_ = local_5a0._28_4_;
            auVar70._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
            fVar142 = auVar119._0_4_;
            fVar141 = auVar119._4_4_;
            fVar179 = auVar119._8_4_;
            fVar180 = auVar119._12_4_;
            fVar181 = auVar119._16_4_;
            fVar182 = auVar119._20_4_;
            fVar183 = auVar119._24_4_;
            auVar71._4_4_ = fVar141 * fVar141 * fVar141 * auVar193._4_4_ * -0.5;
            auVar71._0_4_ = fVar142 * fVar142 * fVar142 * auVar193._0_4_ * -0.5;
            auVar71._8_4_ = fVar179 * fVar179 * fVar179 * auVar193._8_4_ * -0.5;
            auVar71._12_4_ = fVar180 * fVar180 * fVar180 * auVar193._12_4_ * -0.5;
            auVar71._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar71._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar71._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar71._28_4_ = 0;
            auVar193 = vfmadd231ps_fma(auVar71,auVar229,auVar119);
            fVar142 = auVar193._0_4_;
            auVar219._0_4_ = auVar178._0_4_ * fVar142;
            fVar141 = auVar193._4_4_;
            auVar219._4_4_ = auVar178._4_4_ * fVar141;
            fVar179 = auVar193._8_4_;
            auVar219._8_4_ = auVar178._8_4_ * fVar179;
            fVar180 = auVar193._12_4_;
            auVar219._12_4_ = auVar178._12_4_ * fVar180;
            auVar219._16_4_ = auVar178._16_4_ * 0.0;
            auVar219._20_4_ = auVar178._20_4_ * 0.0;
            auVar219._24_4_ = auVar178._24_4_ * 0.0;
            auVar219._28_4_ = 0;
            auVar72._4_4_ = fVar141 * -auVar121._4_4_;
            auVar72._0_4_ = fVar142 * -auVar121._0_4_;
            auVar72._8_4_ = fVar179 * -auVar121._8_4_;
            auVar72._12_4_ = fVar180 * -auVar121._12_4_;
            auVar72._16_4_ = -auVar121._16_4_ * 0.0;
            auVar72._20_4_ = -auVar121._20_4_ * 0.0;
            auVar72._24_4_ = -auVar121._24_4_ * 0.0;
            auVar72._28_4_ = auVar119._28_4_;
            auVar73._28_4_ = 0xbf000000;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
            auVar193 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar19),local_4c0);
            auVar119 = ZEXT1632(auVar19);
            auVar21 = vfmadd213ps_fma(auVar69,auVar119,local_480);
            auVar149 = vfmadd213ps_fma(auVar70,auVar119,ZEXT1632(auVar106));
            auVar186 = vfnmadd213ps_fma(auVar68,auVar119,local_4c0);
            auVar165 = vfmadd213ps_fma(auVar219,ZEXT1632(auVar20),local_600);
            auVar194 = vfnmadd213ps_fma(auVar69,auVar119,local_480);
            auVar119 = ZEXT1632(auVar20);
            auVar185 = vfmadd213ps_fma(auVar72,auVar119,local_700);
            auVar120 = ZEXT1632(auVar19);
            auVar19 = vfnmadd231ps_fma(ZEXT1632(auVar106),auVar120,auVar70);
            auVar106 = vfmadd213ps_fma(auVar73,auVar119,ZEXT1632(auVar107));
            auVar195 = vfnmadd213ps_fma(auVar219,auVar119,local_600);
            auVar25 = vfnmadd213ps_fma(auVar72,auVar119,local_700);
            auVar26 = vfnmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar20),auVar73);
            auVar119 = vsubps_avx(ZEXT1632(auVar185),ZEXT1632(auVar194));
            auVar121 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar19));
            auVar74._4_4_ = auVar119._4_4_ * auVar19._4_4_;
            auVar74._0_4_ = auVar119._0_4_ * auVar19._0_4_;
            auVar74._8_4_ = auVar119._8_4_ * auVar19._8_4_;
            auVar74._12_4_ = auVar119._12_4_ * auVar19._12_4_;
            auVar74._16_4_ = auVar119._16_4_ * 0.0;
            auVar74._20_4_ = auVar119._20_4_ * 0.0;
            auVar74._24_4_ = auVar119._24_4_ * 0.0;
            auVar74._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar74,ZEXT1632(auVar194),auVar121);
            auVar75._4_4_ = auVar186._4_4_ * auVar121._4_4_;
            auVar75._0_4_ = auVar186._0_4_ * auVar121._0_4_;
            auVar75._8_4_ = auVar186._8_4_ * auVar121._8_4_;
            auVar75._12_4_ = auVar186._12_4_ * auVar121._12_4_;
            auVar75._16_4_ = auVar121._16_4_ * 0.0;
            auVar75._20_4_ = auVar121._20_4_ * 0.0;
            auVar75._24_4_ = auVar121._24_4_ * 0.0;
            auVar75._28_4_ = auVar121._28_4_;
            auVar205 = ZEXT1632(auVar186);
            auVar121 = vsubps_avx(ZEXT1632(auVar165),auVar205);
            auVar154 = ZEXT1632(auVar19);
            auVar19 = vfmsub231ps_fma(auVar75,auVar154,auVar121);
            auVar76._4_4_ = auVar194._4_4_ * auVar121._4_4_;
            auVar76._0_4_ = auVar194._0_4_ * auVar121._0_4_;
            auVar76._8_4_ = auVar194._8_4_ * auVar121._8_4_;
            auVar76._12_4_ = auVar194._12_4_ * auVar121._12_4_;
            auVar76._16_4_ = auVar121._16_4_ * 0.0;
            auVar76._20_4_ = auVar121._20_4_ * 0.0;
            auVar76._24_4_ = auVar121._24_4_ * 0.0;
            auVar76._28_4_ = auVar121._28_4_;
            auVar186 = vfmsub231ps_fma(auVar76,auVar205,auVar119);
            auVar119 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar119,ZEXT1632(auVar19));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar119,ZEXT1632(auVar107));
            auVar23 = vcmpps_avx(ZEXT1632(auVar19),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar119 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar193),auVar23);
            local_740 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar21),auVar23);
            auVar121 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar149),auVar23);
            auVar178 = vblendvps_avx(auVar205,ZEXT1632(auVar165),auVar23);
            auVar117 = vblendvps_avx(ZEXT1632(auVar194),ZEXT1632(auVar185),auVar23);
            auVar132 = vblendvps_avx(auVar154,ZEXT1632(auVar106),auVar23);
            auVar205 = vblendvps_avx(ZEXT1632(auVar165),auVar205,auVar23);
            auVar174 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar194),auVar23);
            auVar19 = vpackssdw_avx(local_5e0._0_16_,local_5e0._16_16_);
            auVar154 = vblendvps_avx(ZEXT1632(auVar106),auVar154,auVar23);
            auVar205 = vsubps_avx(auVar205,auVar119);
            auVar174 = vsubps_avx(auVar174,local_740);
            auVar22 = vsubps_avx(auVar154,auVar121);
            auVar111 = vsubps_avx(auVar119,auVar178);
            auVar127 = vsubps_avx(local_740,auVar117);
            auVar151 = vsubps_avx(auVar121,auVar132);
            auVar175._0_4_ = auVar22._0_4_ * auVar119._0_4_;
            auVar175._4_4_ = auVar22._4_4_ * auVar119._4_4_;
            auVar175._8_4_ = auVar22._8_4_ * auVar119._8_4_;
            auVar175._12_4_ = auVar22._12_4_ * auVar119._12_4_;
            auVar175._16_4_ = auVar22._16_4_ * auVar119._16_4_;
            auVar175._20_4_ = auVar22._20_4_ * auVar119._20_4_;
            auVar175._24_4_ = auVar22._24_4_ * auVar119._24_4_;
            auVar175._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar175,auVar121,auVar205);
            auVar77._4_4_ = auVar205._4_4_ * local_740._4_4_;
            auVar77._0_4_ = auVar205._0_4_ * local_740._0_4_;
            auVar77._8_4_ = auVar205._8_4_ * local_740._8_4_;
            auVar77._12_4_ = auVar205._12_4_ * local_740._12_4_;
            auVar77._16_4_ = auVar205._16_4_ * local_740._16_4_;
            auVar77._20_4_ = auVar205._20_4_ * local_740._20_4_;
            auVar77._24_4_ = auVar205._24_4_ * local_740._24_4_;
            auVar77._28_4_ = auVar154._28_4_;
            auVar106 = vfmsub231ps_fma(auVar77,auVar119,auVar174);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
            auVar176._0_4_ = auVar121._0_4_ * auVar174._0_4_;
            auVar176._4_4_ = auVar121._4_4_ * auVar174._4_4_;
            auVar176._8_4_ = auVar121._8_4_ * auVar174._8_4_;
            auVar176._12_4_ = auVar121._12_4_ * auVar174._12_4_;
            auVar176._16_4_ = auVar121._16_4_ * auVar174._16_4_;
            auVar176._20_4_ = auVar121._20_4_ * auVar174._20_4_;
            auVar176._24_4_ = auVar121._24_4_ * auVar174._24_4_;
            auVar176._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar176,local_740,auVar22);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar217 = ZEXT3264(auVar178);
            auVar177._0_4_ = auVar151._0_4_ * auVar178._0_4_;
            auVar177._4_4_ = auVar151._4_4_ * auVar178._4_4_;
            auVar177._8_4_ = auVar151._8_4_ * auVar178._8_4_;
            auVar177._12_4_ = auVar151._12_4_ * auVar178._12_4_;
            auVar177._16_4_ = auVar151._16_4_ * auVar178._16_4_;
            auVar177._20_4_ = auVar151._20_4_ * auVar178._20_4_;
            auVar177._24_4_ = auVar151._24_4_ * auVar178._24_4_;
            auVar177._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar177,auVar111,auVar132);
            auVar78._4_4_ = auVar127._4_4_ * auVar132._4_4_;
            auVar78._0_4_ = auVar127._0_4_ * auVar132._0_4_;
            auVar78._8_4_ = auVar127._8_4_ * auVar132._8_4_;
            auVar78._12_4_ = auVar127._12_4_ * auVar132._12_4_;
            auVar78._16_4_ = auVar127._16_4_ * auVar132._16_4_;
            auVar78._20_4_ = auVar127._20_4_ * auVar132._20_4_;
            auVar78._24_4_ = auVar127._24_4_ * auVar132._24_4_;
            auVar78._28_4_ = auVar132._28_4_;
            auVar193 = vfmsub231ps_fma(auVar78,auVar117,auVar151);
            auVar79._4_4_ = auVar111._4_4_ * auVar117._4_4_;
            auVar79._0_4_ = auVar111._0_4_ * auVar117._0_4_;
            auVar79._8_4_ = auVar111._8_4_ * auVar117._8_4_;
            auVar79._12_4_ = auVar111._12_4_ * auVar117._12_4_;
            auVar79._16_4_ = auVar111._16_4_ * auVar117._16_4_;
            auVar79._20_4_ = auVar111._20_4_ * auVar117._20_4_;
            auVar79._24_4_ = auVar111._24_4_ * auVar117._24_4_;
            auVar79._28_4_ = auVar117._28_4_;
            auVar21 = vfmsub231ps_fma(auVar79,auVar127,auVar178);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
            auVar193 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar193));
            auVar178 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar193));
            auVar178 = vcmpps_avx(auVar178,ZEXT832(0) << 0x20,2);
            auVar107 = vpackssdw_avx(auVar178._0_16_,auVar178._16_16_);
            auVar19 = vpand_avx(auVar107,auVar19);
            auVar178 = vpmovsxwd_avx2(auVar19);
            if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar178 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar178 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar178 >> 0x7f,0) == '\0') &&
                  (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar178 >> 0xbf,0) == '\0') &&
                (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar178[0x1f]) {
LAB_017f5576:
              auVar164._8_8_ = local_6a0[1]._8_8_;
              auVar164._0_8_ = local_6a0[1]._0_8_;
              auVar164._16_8_ = local_6a0[1]._16_8_;
              auVar164._24_8_ = local_6a0[1]._24_8_;
            }
            else {
              auVar80._4_4_ = auVar151._4_4_ * auVar174._4_4_;
              auVar80._0_4_ = auVar151._0_4_ * auVar174._0_4_;
              auVar80._8_4_ = auVar151._8_4_ * auVar174._8_4_;
              auVar80._12_4_ = auVar151._12_4_ * auVar174._12_4_;
              auVar80._16_4_ = auVar151._16_4_ * auVar174._16_4_;
              auVar80._20_4_ = auVar151._20_4_ * auVar174._20_4_;
              auVar80._24_4_ = auVar151._24_4_ * auVar174._24_4_;
              auVar80._28_4_ = auVar178._28_4_;
              auVar165 = vfmsub231ps_fma(auVar80,auVar127,auVar22);
              auVar191._0_4_ = auVar22._0_4_ * auVar111._0_4_;
              auVar191._4_4_ = auVar22._4_4_ * auVar111._4_4_;
              auVar191._8_4_ = auVar22._8_4_ * auVar111._8_4_;
              auVar191._12_4_ = auVar22._12_4_ * auVar111._12_4_;
              auVar191._16_4_ = auVar22._16_4_ * auVar111._16_4_;
              auVar191._20_4_ = auVar22._20_4_ * auVar111._20_4_;
              auVar191._24_4_ = auVar22._24_4_ * auVar111._24_4_;
              auVar191._28_4_ = 0;
              auVar149 = vfmsub231ps_fma(auVar191,auVar205,auVar151);
              auVar81._4_4_ = auVar205._4_4_ * auVar127._4_4_;
              auVar81._0_4_ = auVar205._0_4_ * auVar127._0_4_;
              auVar81._8_4_ = auVar205._8_4_ * auVar127._8_4_;
              auVar81._12_4_ = auVar205._12_4_ * auVar127._12_4_;
              auVar81._16_4_ = auVar205._16_4_ * auVar127._16_4_;
              auVar81._20_4_ = auVar205._20_4_ * auVar127._20_4_;
              auVar81._24_4_ = auVar205._24_4_ * auVar127._24_4_;
              auVar81._28_4_ = auVar127._28_4_;
              auVar185 = vfmsub231ps_fma(auVar81,auVar111,auVar174);
              auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar149),ZEXT1632(auVar185));
              auVar21 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar165),ZEXT832(0) << 0x20);
              auVar178 = vrcpps_avx(ZEXT1632(auVar21));
              auVar216._8_4_ = 0x3f800000;
              auVar216._0_8_ = 0x3f8000003f800000;
              auVar216._12_4_ = 0x3f800000;
              auVar216._16_4_ = 0x3f800000;
              auVar216._20_4_ = 0x3f800000;
              auVar216._24_4_ = 0x3f800000;
              auVar216._28_4_ = 0x3f800000;
              auVar217 = ZEXT3264(auVar216);
              auVar107 = vfnmadd213ps_fma(auVar178,ZEXT1632(auVar21),auVar216);
              auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar178,auVar178);
              auVar82._4_4_ = auVar185._4_4_ * auVar121._4_4_;
              auVar82._0_4_ = auVar185._0_4_ * auVar121._0_4_;
              auVar82._8_4_ = auVar185._8_4_ * auVar121._8_4_;
              auVar82._12_4_ = auVar185._12_4_ * auVar121._12_4_;
              auVar82._16_4_ = auVar121._16_4_ * 0.0;
              auVar82._20_4_ = auVar121._20_4_ * 0.0;
              auVar82._24_4_ = auVar121._24_4_ * 0.0;
              auVar82._28_4_ = auVar174._28_4_;
              auVar149 = vfmadd231ps_fma(auVar82,ZEXT1632(auVar149),local_740);
              auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),ZEXT1632(auVar165),auVar119);
              fVar142 = auVar107._0_4_;
              fVar141 = auVar107._4_4_;
              fVar179 = auVar107._8_4_;
              fVar180 = auVar107._12_4_;
              auVar178 = ZEXT1632(CONCAT412(fVar180 * auVar149._12_4_,
                                            CONCAT48(fVar179 * auVar149._8_4_,
                                                     CONCAT44(fVar141 * auVar149._4_4_,
                                                              fVar142 * auVar149._0_4_))));
              uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar163._4_4_ = uVar104;
              auVar163._0_4_ = uVar104;
              auVar163._8_4_ = uVar104;
              auVar163._12_4_ = uVar104;
              auVar163._16_4_ = uVar104;
              auVar163._20_4_ = uVar104;
              auVar163._24_4_ = uVar104;
              auVar163._28_4_ = uVar104;
              auVar119 = vcmpps_avx(local_520,auVar178,2);
              auVar121 = vcmpps_avx(auVar178,auVar163,2);
              auVar119 = vandps_avx(auVar121,auVar119);
              auVar107 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
              auVar19 = vpand_avx(auVar19,auVar107);
              auVar119 = vpmovsxwd_avx2(auVar19);
              if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar119 >> 0x7f,0) == '\0') &&
                    (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar119 >> 0xbf,0) == '\0') &&
                  (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar119[0x1f]) goto LAB_017f5576;
              auVar119 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,4);
              auVar107 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
              auVar19 = vpand_avx(auVar19,auVar107);
              auVar119 = vpmovsxwd_avx2(auVar19);
              auVar164._8_8_ = local_6a0[1]._8_8_;
              auVar164._0_8_ = local_6a0[1]._0_8_;
              auVar164._16_8_ = local_6a0[1]._16_8_;
              auVar164._24_8_ = local_6a0[1]._24_8_;
              if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar119 >> 0x7f,0) != '\0') ||
                    (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar119 >> 0xbf,0) != '\0') ||
                  (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar119[0x1f] < '\0') {
                auVar117 = ZEXT1632(CONCAT412(fVar180 * auVar106._12_4_,
                                              CONCAT48(fVar179 * auVar106._8_4_,
                                                       CONCAT44(fVar141 * auVar106._4_4_,
                                                                fVar142 * auVar106._0_4_))));
                auVar83._28_4_ = SUB84(local_6a0[1]._24_8_,4);
                auVar83._0_28_ =
                     ZEXT1628(CONCAT412(fVar180 * auVar193._12_4_,
                                        CONCAT48(fVar179 * auVar193._8_4_,
                                                 CONCAT44(fVar141 * auVar193._4_4_,
                                                          fVar142 * auVar193._0_4_))));
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar121 = vsubps_avx(auVar199,auVar117);
                local_120 = vblendvps_avx(auVar121,auVar117,auVar23);
                auVar121 = vsubps_avx(auVar199,auVar83);
                local_560 = vblendvps_avx(auVar121,auVar83,auVar23);
                auVar164 = auVar119;
                local_640 = auVar178;
              }
            }
            auVar200 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
            if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar164 >> 0x7f,0) != '\0') ||
                  (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0xbf,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar164[0x1f] < '\0') {
              auVar119 = vsubps_avx(ZEXT1632(auVar20),auVar120);
              auVar19 = vfmadd213ps_fma(auVar119,local_120,auVar120);
              fVar142 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar84._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar142;
              auVar84._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar142;
              auVar84._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar142;
              auVar84._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar142;
              auVar84._16_4_ = fVar142 * 0.0;
              auVar84._20_4_ = fVar142 * 0.0;
              auVar84._24_4_ = fVar142 * 0.0;
              auVar84._28_4_ = fVar142;
              auVar119 = vcmpps_avx(local_640,auVar84,6);
              auVar121 = auVar164 & auVar119;
              if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar121 >> 0x7f,0) != '\0') ||
                    (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0xbf,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar121[0x1f] < '\0') {
                auVar135._8_4_ = 0xbf800000;
                auVar135._0_8_ = 0xbf800000bf800000;
                auVar135._12_4_ = 0xbf800000;
                auVar135._16_4_ = 0xbf800000;
                auVar135._20_4_ = 0xbf800000;
                auVar135._24_4_ = 0xbf800000;
                auVar135._28_4_ = 0xbf800000;
                auVar155._8_4_ = 0x40000000;
                auVar155._0_8_ = 0x4000000040000000;
                auVar155._12_4_ = 0x40000000;
                auVar155._16_4_ = 0x40000000;
                auVar155._20_4_ = 0x40000000;
                auVar155._24_4_ = 0x40000000;
                auVar155._28_4_ = 0x40000000;
                auVar19 = vfmadd213ps_fma(local_560,auVar155,auVar135);
                local_440 = local_120;
                local_420 = ZEXT1632(auVar19);
                local_400 = local_640;
                pGVar17 = (context->scene->geometries).items[(uint)local_860._4_4_].ptr;
                local_560 = local_420;
                if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6c0 = vandps_avx(auVar119,auVar164);
                  fVar142 = (float)local_3e0;
                  local_360[0] = (fVar142 + local_120._0_4_ + 0.0) * local_180;
                  local_360[1] = (fVar142 + local_120._4_4_ + 1.0) * fStack_17c;
                  local_360[2] = (fVar142 + local_120._8_4_ + 2.0) * fStack_178;
                  local_360[3] = (fVar142 + local_120._12_4_ + 3.0) * fStack_174;
                  fStack_350 = (fVar142 + local_120._16_4_ + 4.0) * fStack_170;
                  fStack_34c = (fVar142 + local_120._20_4_ + 5.0) * fStack_16c;
                  fStack_348 = (fVar142 + local_120._24_4_ + 6.0) * fStack_168;
                  fStack_344 = fVar142 + local_120._28_4_ + 7.0;
                  local_560._0_8_ = auVar19._0_8_;
                  local_560._8_8_ = auVar19._8_8_;
                  local_340 = local_560._0_8_;
                  uStack_338 = local_560._8_8_;
                  uStack_330 = 0;
                  uStack_328 = 0;
                  local_320 = local_640;
                  auVar136._8_4_ = 0x7f800000;
                  auVar136._0_8_ = 0x7f8000007f800000;
                  auVar136._12_4_ = 0x7f800000;
                  auVar136._16_4_ = 0x7f800000;
                  auVar136._20_4_ = 0x7f800000;
                  auVar136._24_4_ = 0x7f800000;
                  auVar136._28_4_ = 0x7f800000;
                  auVar119 = vblendvps_avx(auVar136,local_640,local_6c0);
                  auVar121 = vshufps_avx(auVar119,auVar119,0xb1);
                  auVar121 = vminps_avx(auVar119,auVar121);
                  auVar178 = vshufpd_avx(auVar121,auVar121,5);
                  auVar121 = vminps_avx(auVar121,auVar178);
                  auVar178 = vpermpd_avx2(auVar121,0x4e);
                  auVar121 = vminps_avx(auVar121,auVar178);
                  auVar121 = vcmpps_avx(auVar119,auVar121,0);
                  auVar178 = local_6c0 & auVar121;
                  auVar119 = local_6c0;
                  if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar178 >> 0x7f,0) != '\0') ||
                        (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar178 >> 0xbf,0) != '\0') ||
                      (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar178[0x1f] < '\0') {
                    auVar119 = vandps_avx(auVar121,local_6c0);
                  }
                  uVar99 = vmovmskps_avx(auVar119);
                  uVar7 = 0;
                  for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                    uVar7 = uVar7 + 1;
                  }
                  uVar100 = (ulong)uVar7;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar142 = local_360[uVar100];
                    fVar141 = 1.0 - fVar142;
                    auVar107 = ZEXT416((uint)fVar142);
                    auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar107,
                                              ZEXT416(0xc0a00000));
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142 * 3.0)),
                                              ZEXT416((uint)(fVar142 + fVar142)),auVar19);
                    auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar107,
                                              ZEXT416(0x40000000));
                    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * -3.0)),
                                              ZEXT416((uint)(fVar141 + fVar141)),auVar19);
                    auVar106 = vfnmadd231ss_fma(ZEXT416((uint)(fVar142 * (fVar141 + fVar141))),
                                                ZEXT416((uint)fVar141),ZEXT416((uint)fVar141));
                    auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar107,
                                               ZEXT416((uint)(fVar141 * -2.0)));
                    fVar141 = auVar19._0_4_ * 0.5;
                    fVar179 = auVar107._0_4_ * 0.5;
                    auVar160._0_4_ = fVar179 * local_8e0;
                    auVar160._4_4_ = fVar179 * fStack_8dc;
                    auVar160._8_4_ = fVar179 * fStack_8d8;
                    auVar160._12_4_ = fVar179 * fStack_8d4;
                    auVar126._4_4_ = fVar141;
                    auVar126._0_4_ = fVar141;
                    auVar126._8_4_ = fVar141;
                    auVar126._12_4_ = fVar141;
                    auVar19 = vfmadd132ps_fma(auVar126,auVar160,auVar10);
                    fVar141 = auVar20._0_4_ * 0.5;
                    auVar161._4_4_ = fVar141;
                    auVar161._0_4_ = fVar141;
                    auVar161._8_4_ = fVar141;
                    auVar161._12_4_ = fVar141;
                    auVar19 = vfmadd132ps_fma(auVar161,auVar19,auVar11);
                    uVar104 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                    fVar141 = auVar106._0_4_ * 0.5;
                    auVar144._4_4_ = fVar141;
                    auVar144._0_4_ = fVar141;
                    auVar144._8_4_ = fVar141;
                    auVar144._12_4_ = fVar141;
                    auVar19 = vfmadd132ps_fma(auVar144,auVar19,auVar12);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar100 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar19._0_4_;
                    uVar210 = vextractps_avx(auVar19,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar210;
                    uVar210 = vextractps_avx(auVar19,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar210;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar142;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar104;
                    *(uint *)(ray + k * 4 + 0x220) = uVar97;
                    *(undefined4 *)(ray + k * 4 + 0x240) = local_860._4_4_;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_7d8 = context;
                    local_3dc = iVar98;
                    local_3d0 = uVar192;
                    uStack_3c8 = uVar88;
                    local_3c0 = uVar89;
                    uStack_3b8 = uVar90;
                    local_3b0 = uVar91;
                    uStack_3a8 = uVar92;
                    local_3a0 = uVar93;
                    uStack_398 = uVar94;
                    while( true ) {
                      fVar142 = local_360[uVar100];
                      auVar108._4_4_ = fVar142;
                      auVar108._0_4_ = fVar142;
                      auVar108._8_4_ = fVar142;
                      auVar108._12_4_ = fVar142;
                      local_240._16_4_ = fVar142;
                      local_240._0_16_ = auVar108;
                      local_240._20_4_ = fVar142;
                      local_240._24_4_ = fVar142;
                      local_240._28_4_ = fVar142;
                      local_220 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_320 + uVar100 * 4);
                      fVar141 = 1.0 - fVar142;
                      auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar108,
                                                ZEXT416(0xc0a00000));
                      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142 * 3.0)),
                                                ZEXT416((uint)(fVar142 + fVar142)),auVar19);
                      auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar108,
                                                ZEXT416(0x40000000));
                      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * -3.0)),
                                                ZEXT416((uint)(fVar141 + fVar141)),auVar19);
                      auVar106 = vfnmadd231ss_fma(ZEXT416((uint)(fVar142 * (fVar141 + fVar141))),
                                                  ZEXT416((uint)fVar141),ZEXT416((uint)fVar141));
                      auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar108,
                                                 ZEXT416((uint)(fVar141 * -2.0)));
                      fVar142 = auVar19._0_4_ * 0.5;
                      fVar141 = auVar107._0_4_ * 0.5;
                      auVar166._0_4_ = fVar141 * local_8e0;
                      auVar166._4_4_ = fVar141 * fStack_8dc;
                      auVar166._8_4_ = fVar141 * fStack_8d8;
                      auVar166._12_4_ = fVar141 * fStack_8d4;
                      auVar145._4_4_ = fVar142;
                      auVar145._0_4_ = fVar142;
                      auVar145._8_4_ = fVar142;
                      auVar145._12_4_ = fVar142;
                      auVar19 = vfmadd132ps_fma(auVar145,auVar166,auVar13);
                      fVar142 = auVar20._0_4_ * 0.5;
                      auVar167._4_4_ = fVar142;
                      auVar167._0_4_ = fVar142;
                      auVar167._8_4_ = fVar142;
                      auVar167._12_4_ = fVar142;
                      auVar19 = vfmadd132ps_fma(auVar167,auVar19,auVar14);
                      local_808.context = context->user;
                      fVar142 = auVar106._0_4_ * 0.5;
                      auVar146._4_4_ = fVar142;
                      auVar146._0_4_ = fVar142;
                      auVar146._8_4_ = fVar142;
                      auVar146._12_4_ = fVar142;
                      auVar20 = vfmadd132ps_fma(auVar146,auVar19,auVar15);
                      local_2a0 = auVar20._0_4_;
                      uStack_29c = local_2a0;
                      uStack_298 = local_2a0;
                      uStack_294 = local_2a0;
                      uStack_290 = local_2a0;
                      uStack_28c = local_2a0;
                      uStack_288 = local_2a0;
                      uStack_284 = local_2a0;
                      auVar19 = vmovshdup_avx(auVar20);
                      local_280 = auVar19._0_8_;
                      uStack_278 = local_280;
                      uStack_270 = local_280;
                      uStack_268 = local_280;
                      auVar19 = vshufps_avx(auVar20,auVar20,0xaa);
                      auVar147._0_8_ = auVar19._0_8_;
                      auVar147._8_8_ = auVar147._0_8_;
                      auVar156._16_8_ = auVar147._0_8_;
                      auVar156._0_16_ = auVar147;
                      auVar156._24_8_ = auVar147._0_8_;
                      local_260 = auVar156;
                      uStack_21c = local_220;
                      uStack_218 = local_220;
                      uStack_214 = local_220;
                      uStack_210 = local_220;
                      uStack_20c = local_220;
                      uStack_208 = local_220;
                      uStack_204 = local_220;
                      local_200 = CONCAT44(uStack_15c,local_160);
                      uStack_1f8 = CONCAT44(uStack_154,uStack_158);
                      uStack_1f0 = CONCAT44(uStack_14c,uStack_150);
                      uStack_1e8 = CONCAT44(uStack_144,uStack_148);
                      local_1e0._4_4_ = uStack_13c;
                      local_1e0._0_4_ = local_140;
                      local_1e0._8_4_ = uStack_138;
                      local_1e0._12_4_ = uStack_134;
                      local_1e0._16_4_ = uStack_130;
                      local_1e0._20_4_ = uStack_12c;
                      local_1e0._24_4_ = uStack_128;
                      local_1e0._28_4_ = uStack_124;
                      auVar119 = vpcmpeqd_avx2(local_1e0,local_1e0);
                      local_7c8[1] = auVar119;
                      *local_7c8 = auVar119;
                      local_1c0 = (local_808.context)->instID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_1a0 = (local_808.context)->instPrimID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_6a0[0] = local_300;
                      local_808.valid = (int *)local_6a0;
                      local_808.geometryUserPtr = pGVar17->userPtr;
                      local_808.hit = (RTCHitN *)&local_2a0;
                      local_808.N = 8;
                      local_808.ray = (RTCRayN *)ray;
                      if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar156 = ZEXT1632(auVar147);
                        auVar217 = ZEXT1664(auVar217._0_16_);
                        (*pGVar17->intersectionFilterN)(&local_808);
                        context = local_7d8;
                      }
                      auVar121 = vpcmpeqd_avx2(local_6a0[0],_DAT_01faff00);
                      auVar178 = vpcmpeqd_avx2(auVar156,auVar156);
                      auVar119 = auVar178 & ~auVar121;
                      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar119 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar119 >> 0x7f,0) == '\0') &&
                            (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar119 >> 0xbf,0) == '\0') &&
                          (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar119[0x1f]) {
                        auVar121 = auVar121 ^ auVar178;
                      }
                      else {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar178 = ZEXT1632(auVar178._0_16_);
                          auVar217 = ZEXT1664(auVar217._0_16_);
                          (*p_Var18)(&local_808);
                          context = local_7d8;
                        }
                        auVar117 = vpcmpeqd_avx2(local_6a0[0],
                                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar178 = vpcmpeqd_avx2(auVar178,auVar178);
                        auVar121 = auVar117 ^ auVar178;
                        auVar119 = auVar178 & ~auVar117;
                        if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar119 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar119 >> 0x7f,0) != '\0')
                              || (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar119 >> 0xbf,0) != '\0') ||
                            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar119[0x1f] < '\0') {
                          auVar137._0_4_ = auVar117._0_4_ ^ auVar178._0_4_;
                          auVar137._4_4_ = auVar117._4_4_ ^ auVar178._4_4_;
                          auVar137._8_4_ = auVar117._8_4_ ^ auVar178._8_4_;
                          auVar137._12_4_ = auVar117._12_4_ ^ auVar178._12_4_;
                          auVar137._16_4_ = auVar117._16_4_ ^ auVar178._16_4_;
                          auVar137._20_4_ = auVar117._20_4_ ^ auVar178._20_4_;
                          auVar137._24_4_ = auVar117._24_4_ ^ auVar178._24_4_;
                          auVar137._28_4_ = auVar117._28_4_ ^ auVar178._28_4_;
                          auVar119 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])local_808.hit);
                          *(undefined1 (*) [32])(local_808.ray + 0x180) = auVar119;
                          auVar119 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_808.hit + 0x20));
                          *(undefined1 (*) [32])(local_808.ray + 0x1a0) = auVar119;
                          auVar119 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_808.hit + 0x40));
                          *(undefined1 (*) [32])(local_808.ray + 0x1c0) = auVar119;
                          auVar119 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_808.hit + 0x60));
                          *(undefined1 (*) [32])(local_808.ray + 0x1e0) = auVar119;
                          auVar119 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_808.hit + 0x80));
                          *(undefined1 (*) [32])(local_808.ray + 0x200) = auVar119;
                          auVar119 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_808.hit + 0xa0));
                          *(undefined1 (*) [32])(local_808.ray + 0x220) = auVar119;
                          auVar119 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_808.hit + 0xc0));
                          *(undefined1 (*) [32])(local_808.ray + 0x240) = auVar119;
                          auVar119 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_808.hit + 0xe0));
                          *(undefined1 (*) [32])(local_808.ray + 0x260) = auVar119;
                          auVar119 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_808.hit + 0x100));
                          *(undefined1 (*) [32])(local_808.ray + 0x280) = auVar119;
                        }
                      }
                      auVar119 = local_640;
                      if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar121 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar121 >> 0x7f,0) == '\0') &&
                            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar121 >> 0xbf,0) == '\0') &&
                          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar121[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar104;
                      }
                      else {
                        uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                      }
                      *(undefined4 *)(local_6c0 + uVar100 * 4) = 0;
                      auVar122._4_4_ = uVar104;
                      auVar122._0_4_ = uVar104;
                      auVar122._8_4_ = uVar104;
                      auVar122._12_4_ = uVar104;
                      auVar122._16_4_ = uVar104;
                      auVar122._20_4_ = uVar104;
                      auVar122._24_4_ = uVar104;
                      auVar122._28_4_ = uVar104;
                      auVar178 = vcmpps_avx(auVar119,auVar122,2);
                      auVar121 = vandps_avx(auVar178,local_6c0);
                      local_6c0 = local_6c0 & auVar178;
                      if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6c0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                            (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                          (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6c0[0x1f]) break;
                      auVar138._8_4_ = 0x7f800000;
                      auVar138._0_8_ = 0x7f8000007f800000;
                      auVar138._12_4_ = 0x7f800000;
                      auVar138._16_4_ = 0x7f800000;
                      auVar138._20_4_ = 0x7f800000;
                      auVar138._24_4_ = 0x7f800000;
                      auVar138._28_4_ = 0x7f800000;
                      auVar119 = vblendvps_avx(auVar138,auVar119,auVar121);
                      auVar178 = vshufps_avx(auVar119,auVar119,0xb1);
                      auVar178 = vminps_avx(auVar119,auVar178);
                      auVar117 = vshufpd_avx(auVar178,auVar178,5);
                      auVar178 = vminps_avx(auVar178,auVar117);
                      auVar117 = vpermpd_avx2(auVar178,0x4e);
                      auVar178 = vminps_avx(auVar178,auVar117);
                      auVar178 = vcmpps_avx(auVar119,auVar178,0);
                      auVar117 = auVar121 & auVar178;
                      auVar119 = auVar121;
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar117 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar117 >> 0x7f,0) != '\0') ||
                            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0xbf,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar117[0x1f] < '\0') {
                        auVar119 = vandps_avx(auVar178,auVar121);
                      }
                      uVar99 = vmovmskps_avx(auVar119);
                      uVar7 = 0;
                      for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                        uVar7 = uVar7 + 1;
                      }
                      uVar100 = (ulong)uVar7;
                      local_6c0 = auVar121;
                    }
                    auVar200 = ZEXT3264(CONCAT428(fStack_784,
                                                  CONCAT424(fStack_788,
                                                            CONCAT420(fStack_78c,
                                                                      CONCAT416(fStack_790,
                                                                                CONCAT412(fStack_794
                                                                                          ,CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
                  }
                }
              }
            }
          }
          lVar103 = lVar103 + 8;
        } while ((int)lVar103 < iVar98);
      }
      uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar118._4_4_ = uVar104;
      auVar118._0_4_ = uVar104;
      auVar118._8_4_ = uVar104;
      auVar118._12_4_ = uVar104;
      auVar118._16_4_ = uVar104;
      auVar118._20_4_ = uVar104;
      auVar118._24_4_ = uVar104;
      auVar118._28_4_ = uVar104;
      auVar119 = vcmpps_avx(local_80,auVar118,2);
      uVar97 = vmovmskps_avx(auVar119);
      uVar97 = (uint)uVar102 & uVar97;
    } while (uVar97 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }